

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O1

QPlatformScreen * __thiscall
QKmsDevice::createScreenForConnector
          (QKmsDevice *this,drmModeResPtr resources,drmModeConnectorPtr connector,ScreenInfo *vinfo)

{
  QList<QKmsPlane> *this_00;
  QList<_drmModeModeInfo> *this_01;
  ushort uVar1;
  ushort uVar2;
  long lVar3;
  QKmsPlane *pQVar4;
  drmModeModeInfoPtr p_Var5;
  Data *pDVar6;
  QArrayData *pQVar7;
  Data *pDVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  QSize QVar13;
  qsizetype i;
  Representation RVar14;
  Representation RVar15;
  undefined8 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  QKmsPlane *pQVar25;
  bool bVar26;
  bool bVar27;
  char cVar28;
  uint uVar29;
  int iVar30;
  uint uVar31;
  uint uVar32;
  int iVar33;
  const_iterator cVar34;
  long lVar35;
  long lVar36;
  pointer p_Var37;
  iterator iVar38;
  iterator iVar39;
  int *piVar40;
  long lVar41;
  undefined4 extraout_var;
  QString *pQVar42;
  char cVar43;
  QKmsPlane *plane;
  QTextStream *pQVar44;
  ulong uVar45;
  QPlatformScreen *pQVar46;
  uint32_t uVar47;
  char *pcVar48;
  storage_type *psVar49;
  uint32_t *puVar50;
  char16_t *pcVar51;
  drmModeModeInfo *pdVar52;
  _func_int **pp_Var53;
  uint uVar54;
  ulong uVar55;
  uint uVar56;
  _drmModeModeInfo *__s2;
  ulong uVar57;
  long in_FS_OFFSET;
  bool bVar58;
  byte bVar59;
  undefined1 auVar60 [16];
  QByteArrayView QVar61;
  QByteArrayView QVar62;
  QByteArrayView QVar63;
  QByteArrayView QVar64;
  QByteArrayView QVar65;
  QByteArrayView QVar66;
  QByteArrayView QVar67;
  QByteArrayView QVar68;
  QByteArrayView QVar69;
  QByteArrayView QVar70;
  QByteArrayView QVar71;
  QByteArrayView QVar72;
  QByteArrayView QVar73;
  QByteArrayView QVar74;
  QByteArrayView QVar75;
  QByteArrayView QVar76;
  QByteArrayView QVar77;
  QByteArrayView QVar78;
  QByteArrayView QVar79;
  QByteArrayView QVar80;
  QByteArrayView QVar81;
  QByteArrayView QVar82;
  QByteArrayView QVar83;
  QByteArrayView QVar84;
  QByteArrayView QVar85;
  QByteArrayView QVar86;
  QStringView QVar87;
  QStringView QVar88;
  QList<QKmsPlane> *__range5;
  uint local_3b0;
  QArrayDataPointer<QString> local_368;
  bool ok;
  QSize local_348;
  undefined1 local_340 [8];
  QString local_338;
  QSize framebufferSize;
  undefined1 local_310 [16];
  undefined1 auStack_300 [40];
  undefined1 *local_2d8;
  Data *local_2c8;
  QKmsPlane *pQStack_2c0;
  QList<_drmModeModeInfo> local_2b8;
  QByteArray local_298;
  QVariantMap userConnectorConfig;
  QMap<QString,_QMap<QString,_QVariant>_> userConfig;
  int configurationRefresh;
  QSize configurationSize;
  QByteArray connectorName;
  undefined1 local_238 [24];
  Data *local_220;
  undefined1 local_218 [32];
  anon_union_24_3_e3d07ef4_for_data local_1f8;
  char *local_1e0;
  drmModeModeInfo crtc_mode;
  anon_union_24_3_e3d07ef4_for_data local_188;
  undefined8 uStack_170;
  ulong local_168;
  Data *local_160;
  QKmsPlane *pQStack_158;
  undefined8 local_150;
  ulong uStack_148;
  drmModeCrtcPtr local_140;
  undefined1 auStack_138 [24];
  undefined8 local_120;
  drmModePropertyPtr p_Stack_118;
  drmModePropertyBlobPtr local_110;
  uint uStack_108;
  uint32_t uStack_104;
  uint uStack_100;
  uint uStack_fc;
  uint uStack_f8;
  undefined4 uStack_f4;
  QString QStack_f0;
  undefined1 auStack_d8 [24];
  QKmsPlane *local_c0;
  QSize QStack_b8;
  undefined8 local_b0;
  QSize QStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  drmModeModeInfo configurationModeline;
  
  bVar59 = 0;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  connectorName.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  connectorName.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  connectorName.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(&connectorName,"UNKNOWN",-1);
  if ((ulong)connector->connector_type < 0x11) {
    QByteArray::operator=
              (&connectorName,
               _ZL20connector_type_names_rel +
               *(int *)(_ZL20connector_type_names_rel + (ulong)connector->connector_type * 4));
  }
  QByteArray::number((uint)&local_188,connector->connector_type_id);
  QByteArray::append(&connectorName);
  piVar40 = (int *)CONCAT44(local_188._4_4_,local_188._0_4_);
  if (piVar40 != (int *)0x0) {
    LOCK();
    *piVar40 = *piVar40 + -1;
    UNLOCK();
    if (*piVar40 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_188._4_4_,local_188._0_4_),1,0x10);
    }
  }
  uVar29 = crtcForConnector(this,resources,connector);
  if ((int)uVar29 < 0) {
    local_188._0_4_ = 2;
    local_188._4_4_ = 0;
    local_188._8_4_ = 0;
    local_188._12_4_ = 0;
    local_188._16_4_ = 0;
    local_188._20_4_ = 0;
    uStack_170 = "default";
    QMessageLogger::warning();
    uVar16 = crtc_mode._0_8_;
    QVar70.m_data = (storage_type *)0x29;
    QVar70.m_size = (qsizetype)&configurationModeline;
    QString::fromUtf8(QVar70);
    QTextStream::operator<<((QTextStream *)uVar16,(QString *)&configurationModeline);
    if (configurationModeline._0_8_ != 0) {
      LOCK();
      *(int *)configurationModeline._0_8_ = *(int *)configurationModeline._0_8_ + -1;
      UNLOCK();
      if (*(int *)configurationModeline._0_8_ == 0) {
        QArrayData::deallocate((QArrayData *)configurationModeline._0_8_,2,0x10);
      }
    }
    if (*(char *)(crtc_mode._0_8_ + 0x30) == '\x01') {
      QTextStream::operator<<((QTextStream *)crtc_mode._0_8_,' ');
    }
    pcVar48 = connectorName.d.ptr;
    if (connectorName.d.ptr == (char *)0x0) {
      pcVar48 = (char *)&QByteArray::_empty;
    }
    QDebug::putByteArray((char *)&crtc_mode,(ulong)pcVar48,(Latin1Content)connectorName.d.size);
    if (*(char *)(crtc_mode._0_8_ + 0x30) == '\x01') {
      QTextStream::operator<<((QTextStream *)crtc_mode._0_8_,' ');
    }
    QDebug::~QDebug((QDebug *)&crtc_mode);
    pQVar46 = (QPlatformScreen *)0x0;
    goto LAB_00132bc9;
  }
  configurationSize.wd.m_i = -1;
  configurationSize.ht.m_i = -1;
  configurationRefresh = 0;
  configurationModeline.name._12_8_ = &DAT_aaaaaaaaaaaaaaaa;
  configurationModeline.name._20_8_ = &DAT_aaaaaaaaaaaaaaaa;
  configurationModeline._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  configurationModeline.name._4_8_ = &DAT_aaaaaaaaaaaaaaaa;
  configurationModeline._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  configurationModeline._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  configurationModeline._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  configurationModeline._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  configurationModeline.name[0x1c] = -0x56;
  configurationModeline.name[0x1d] = -0x56;
  configurationModeline.name[0x1e] = -0x56;
  configurationModeline.name[0x1f] = -0x56;
  userConfig.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>_>
        )(this->m_screenConfig->m_outputSettings).d.d.ptr;
  if (userConfig.d.d.ptr !=
      (totally_ordered_wrapper<QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>_*>
       )0x0) {
    LOCK();
    *(int *)userConfig.d.d.ptr = *(int *)userConfig.d.d.ptr + 1;
    UNLOCK();
  }
  userConnectorConfig.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
        )&DAT_aaaaaaaaaaaaaaaa;
  QVar61.m_data = (storage_type *)connectorName.d.size;
  QVar61.m_size = (qsizetype)&local_188;
  QString::fromUtf8(QVar61);
  crtc_mode.clock = 0;
  crtc_mode.hdisplay = 0;
  crtc_mode.hsync_start = 0;
  QMap<QString,_QMap<QString,_QVariant>_>::value
            ((QMap<QString,_QMap<QString,_QVariant>_> *)&userConnectorConfig,(QString *)&userConfig,
             (QMap<QString,_QVariant> *)&local_188.shared);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2
            ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
              *)&crtc_mode);
  piVar40 = (int *)CONCAT44(local_188._4_4_,local_188._0_4_);
  if (piVar40 != (int *)0x0) {
    LOCK();
    *piVar40 = *piVar40 + -1;
    UNLOCK();
    if (*piVar40 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_188._4_4_,local_188._0_4_),2,0x10);
    }
  }
  local_298.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_298.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_298.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_218._0_8_ = (QArrayData *)0x0;
  local_218._8_8_ = L"mode";
  local_218._16_8_ = 4;
  local_238._0_8_ = (QArrayData *)0x0;
  local_238._8_8_ = L"preferred";
  local_238._16_8_ = (undefined1 *)0x9;
  QVariant::QVariant((QVariant *)&crtc_mode,(QString *)local_238);
  QMap<QString,_QVariant>::value
            ((QVariant *)&local_188,&userConnectorConfig,(QString *)local_218,(QVariant *)&crtc_mode
            );
  QVariant::toByteArray();
  QByteArray::toLower_helper(&local_298);
  piVar40 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
  if (piVar40 != (int *)0x0) {
    LOCK();
    *piVar40 = *piVar40 + -1;
    UNLOCK();
    if (*piVar40 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),1,0x10);
    }
  }
  QVariant::~QVariant((QVariant *)&local_188);
  QVariant::~QVariant((QVariant *)&crtc_mode);
  if ((QArrayData *)local_238._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_238._0_8_ = *(int *)local_238._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_238._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_218._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_218._0_8_ = *(int *)local_218._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_218._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_218._0_8_,2,0x10);
    }
  }
  local_188._0_4_ = 0x1486b4;
  local_188._4_4_ = 0;
  bVar26 = operator==(&local_298,(char **)&local_188.shared);
  if (bVar26) {
    bVar9 = false;
LAB_00131ba4:
    bVar27 = false;
LAB_00131ba7:
    bVar11 = false;
LAB_00131ba9:
    bVar12 = false;
LAB_00131bab:
    bVar10 = false;
  }
  else {
    local_188._0_4_ = 0x1486b8;
    local_188._4_4_ = 0;
    bVar27 = operator==(&local_298,(char **)&local_188.shared);
    if (bVar27) {
LAB_00131b9e:
      bVar9 = true;
      goto LAB_00131ba4;
    }
    local_188._0_4_ = 0x1486c2;
    local_188._4_4_ = 0;
    bVar27 = operator==(&local_298,(char **)&local_188.shared);
    if (bVar27) {
      bVar12 = true;
      bVar9 = false;
      bVar27 = false;
      bVar11 = false;
      goto LAB_00131bab;
    }
    local_188._0_4_ = 0x1486ca;
    local_188._4_4_ = 0;
    bVar27 = operator==(&local_298,(char **)&local_188.shared);
    if (bVar27) {
      bVar27 = true;
      bVar9 = false;
      goto LAB_00131ba7;
    }
    pcVar48 = local_298.d.ptr;
    if (local_298.d.ptr == (char *)0x0) {
      pcVar48 = (char *)&QByteArray::_empty;
    }
    iVar30 = __isoc99_sscanf(pcVar48,"%dx%d@%d",&configurationSize,&configurationSize.ht,
                             &configurationRefresh);
    bVar10 = true;
    if (iVar30 != 3) {
      pcVar48 = local_298.d.ptr;
      if (local_298.d.ptr == (char *)0x0) {
        pcVar48 = (char *)&QByteArray::_empty;
      }
      bVar9 = false;
      iVar30 = __isoc99_sscanf(pcVar48,"%dx%d",&configurationSize,&configurationSize.ht);
      bVar27 = false;
      bVar11 = false;
      bVar12 = false;
      if (iVar30 == 2) goto LAB_00131bb3;
      bVar27 = parseModeline(&local_298,&configurationModeline);
      if (!bVar27) {
        createScreenForConnector();
        goto LAB_00131b9e;
      }
      bVar11 = true;
      bVar9 = false;
      bVar27 = false;
      goto LAB_00131ba9;
    }
    bVar9 = false;
    bVar27 = false;
    bVar11 = false;
    bVar12 = false;
    bVar10 = true;
  }
LAB_00131bb3:
  memset(&local_188,0,0xf8);
  local_150 = 0xbff0000000000000;
  uStack_148 = 0xbff0000000000000;
  local_140 = (drmModeCrtcPtr)0xffffffffffffffff;
  auStack_138._0_8_ = auStack_138._0_8_ & 0xffffffffffffff00;
  auStack_138._8_8_ = (_drmModeModeInfo *)0x0;
  auStack_138._16_8_ = (QArrayData *)0x0;
  local_120 = 0;
  p_Stack_118 = (drmModePropertyPtr)0x0;
  local_110 = (drmModePropertyBlobPtr)CONCAT44(local_110._4_4_,1);
  uStack_f4 = 0;
  QStack_f0.d.d._0_4_ = (uint)QStack_f0.d.d & 0xffffff00;
  uStack_108 = 0;
  uStack_104 = 0;
  uStack_100 = 0;
  uStack_fc = 0;
  uStack_f8 = uStack_f8 & 0xffffff00;
  QStack_f0.d.d._4_4_ = 0x34325258;
  QStack_f0.d.ptr._0_1_ = 0;
  QStack_f0.d.size = 0;
  auStack_d8._0_8_ = (Data *)0x0;
  auStack_d8._8_8_ = (QKmsPlane *)0x0;
  auStack_d8._16_8_ = (Data *)0x0;
  local_c0 = (QKmsPlane *)0x0;
  QStack_b8.wd.m_i = 0;
  QStack_b8.ht.m_i = 0;
  local_b0 = (QKmsPlane *)0x0;
  QStack_a8.wd.m_i = -1;
  QStack_a8.ht.m_i = -1;
  local_a0 = 0;
  uStack_98 = 0;
  *(undefined8 *)((long)&(vinfo->virtualPos).xp.m_i + 1) = 0;
  vinfo->virtualIndex = 0;
  (vinfo->virtualPos).xp = 0;
  pDVar6 = (vinfo->output).name.d.d;
  pcVar51 = (vinfo->output).name.d.ptr;
  (vinfo->output).name.d.d = (Data *)CONCAT44(local_188._20_4_,local_188._16_4_);
  (vinfo->output).name.d.ptr = (char16_t *)uStack_170;
  local_188._16_4_ = SUB84(pDVar6,0);
  local_188._20_4_ = (undefined4)((ulong)pDVar6 >> 0x20);
  uVar45 = (vinfo->output).name.d.size;
  (vinfo->output).name.d.size = local_168;
  (vinfo->output).saved_crtc = (drmModeCrtcPtr)0x0;
  (vinfo->output).preferred_mode = -1;
  (vinfo->output).mode = -1;
  *(undefined8 *)&(vinfo->output).mode_set = auStack_138._0_8_;
  (vinfo->output).physical_size.wd = -1.0;
  (vinfo->output).physical_size.ht = -1.0;
  *(Data **)&(vinfo->output).connector_id = local_160;
  *(QKmsPlane **)&(vinfo->output).crtc_id = pQStack_158;
  this_01 = &(vinfo->output).modes;
  uStack_170 = (char *)pcVar51;
  local_168 = uVar45;
  QArrayDataPointer<_drmModeModeInfo>::operator=
            (&this_01->d,(QArrayDataPointer<_drmModeModeInfo> *)(auStack_138 + 0x10));
  QVar13 = QStack_b8;
  pQVar25 = local_c0;
  uVar16 = auStack_d8._16_8_;
  *(drmModePropertyBlobPtr *)&(vinfo->output).subpixel = local_110;
  (vinfo->output).dpms_prop = (drmModePropertyPtr)CONCAT44(uStack_104,uStack_108);
  (vinfo->output).edid_blob = (drmModePropertyBlobPtr)CONCAT44(uStack_fc,uStack_100);
  (vinfo->output).wants_forced_plane = (bool)(char)uStack_f8;
  *(int3 *)&(vinfo->output).field_0x81 = (int3)(uStack_f8 >> 8);
  (vinfo->output).forced_plane_id = uStack_f4;
  *(ulong *)&(vinfo->output).field_0x81 =
       CONCAT17(QStack_f0.d.d._0_1_,CONCAT43(uStack_f4,uStack_f8._1_3_));
  *(ulong *)&(vinfo->output).field_0x89 =
       CONCAT17(QStack_f0.d.ptr._0_1_,CONCAT43(QStack_f0.d.d._4_4_,QStack_f0.d.d._1_3_));
  pQVar7 = &((vinfo->output).clone_source.d.d)->super_QArrayData;
  pDVar8 = (Data *)(vinfo->output).clone_source.d.ptr;
  (vinfo->output).clone_source.d.d = (Data *)QStack_f0.d.size;
  (vinfo->output).clone_source.d.ptr = (char16_t *)auStack_d8._0_8_;
  pQVar4 = (QKmsPlane *)(vinfo->output).clone_source.d.size;
  (vinfo->output).clone_source.d.size = auStack_d8._8_8_;
  auStack_d8._16_8_ = 0;
  local_c0 = (QKmsPlane *)0x0;
  QStack_b8.wd.m_i = 0;
  QStack_b8.ht.m_i = 0;
  crtc_mode._0_8_ = (vinfo->output).available_planes.d.d;
  crtc_mode._8_8_ = (vinfo->output).available_planes.d.ptr;
  (vinfo->output).available_planes.d.d = (Data *)uVar16;
  (vinfo->output).available_planes.d.ptr = pQVar25;
  crtc_mode._16_8_ = (vinfo->output).available_planes.d.size;
  (vinfo->output).available_planes.d.size = (qsizetype)QVar13;
  QStack_f0.d.size = (qsizetype)pQVar7;
  auStack_d8._0_8_ = pDVar8;
  auStack_d8._8_8_ = pQVar4;
  QArrayDataPointer<QKmsPlane>::~QArrayDataPointer((QArrayDataPointer<QKmsPlane> *)&crtc_mode);
  (vinfo->output).crtcIdPropertyId = (undefined4)local_a0;
  (vinfo->output).modeIdPropertyId = local_a0._4_4_;
  (vinfo->output).activePropertyId = (undefined4)uStack_98;
  (vinfo->output).mode_blob_id = uStack_98._4_4_;
  (vinfo->output).eglfs_plane = local_b0;
  (vinfo->output).size = QStack_a8;
  QArrayDataPointer<QKmsPlane>::~QArrayDataPointer
            ((QArrayDataPointer<QKmsPlane> *)(auStack_d8 + 0x10));
  if ((QArrayData *)QStack_f0.d.size != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)QStack_f0.d.size)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)QStack_f0.d.size)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)QStack_f0.d.size)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)QStack_f0.d.size,2,0x10);
    }
  }
  if ((QArrayData *)auStack_138._16_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_138._16_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_138._16_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_138._16_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_138._16_8_,0x44,0x10);
    }
  }
  piVar40 = (int *)CONCAT44(local_188._20_4_,local_188._16_4_);
  if (piVar40 != (int *)0x0) {
    LOCK();
    *piVar40 = *piVar40 + -1;
    UNLOCK();
    if (*piVar40 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_188._20_4_,local_188._16_4_),2,0x10);
    }
  }
  local_1f8._0_4_ = 0;
  local_1f8._4_4_ = 0;
  local_1f8._8_4_ = 0x1492d4;
  local_1f8._12_4_ = 0;
  local_1f8._16_4_ = 0xc;
  local_1f8._20_4_ = 0;
  QVariant::QVariant((QVariant *)&crtc_mode,0x7fffffff);
  QMap<QString,_QVariant>::value
            ((QVariant *)&local_188,&userConnectorConfig,(QString *)&local_1f8,
             (QVariant *)&crtc_mode);
  iVar30 = QVariant::toInt((bool *)local_188.data);
  vinfo->virtualIndex = iVar30;
  QVariant::~QVariant((QVariant *)&local_188);
  QVariant::~QVariant((QVariant *)&crtc_mode);
  piVar40 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
  if (piVar40 != (int *)0x0) {
    LOCK();
    *piVar40 = *piVar40 + -1;
    UNLOCK();
    if (*piVar40 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
    }
  }
  local_188._0_4_ = 0;
  local_188._4_4_ = 0;
  local_188._8_4_ = 0x1492ee;
  local_188._12_4_ = 0;
  local_188._16_4_ = 10;
  local_188._20_4_ = 0;
  if (userConnectorConfig.d.d.ptr ==
      (totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
       )0x0) {
    bVar58 = false;
  }
  else {
    cVar34 = std::
             _Rb_tree<QString,_std::pair<const_QString,_QVariant>,_std::_Select1st<std::pair<const_QString,_QVariant>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>
             ::find((_Rb_tree<QString,_std::pair<const_QString,_QVariant>,_std::_Select1st<std::pair<const_QString,_QVariant>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>
                     *)((long)userConnectorConfig.d.d.ptr + 8),(key_type *)&local_188);
    bVar58 = cVar34._M_node != (_Base_ptr)((long)userConnectorConfig.d.d.ptr + 0x10);
  }
  piVar40 = (int *)CONCAT44(local_188._4_4_,local_188._0_4_);
  if (piVar40 != (int *)0x0) {
    LOCK();
    *piVar40 = *piVar40 + -1;
    UNLOCK();
    if (*piVar40 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_188._4_4_,local_188._0_4_),2,0x10);
    }
  }
  if (bVar58) {
    local_1f8._16_4_ = 0xaaaaaaaa;
    local_1f8._20_4_ = 0xaaaaaaaa;
    local_1f8._0_4_ = 0xaaaaaaaa;
    local_1f8._4_4_ = 0xaaaaaaaa;
    local_1f8._8_4_ = 0xaaaaaaaa;
    local_1f8._12_4_ = 0xaaaaaaaa;
    local_218._0_8_ = (QArrayData *)0x0;
    local_218._8_8_ = L"virtualPos";
    local_218._16_8_ = 10;
    crtc_mode.vsync_start = 0;
    crtc_mode.vsync_end = 0;
    crtc_mode.vtotal = 0;
    crtc_mode.vscan = 0;
    crtc_mode.clock = 0;
    crtc_mode.hdisplay = 0;
    crtc_mode.hsync_start = 0;
    crtc_mode.hsync_end = 0;
    crtc_mode.htotal = 0;
    crtc_mode.hskew = 0;
    crtc_mode.vdisplay = 0;
    crtc_mode.vrefresh = 2;
    crtc_mode.flags = 0;
    QMap<QString,_QVariant>::value
              ((QVariant *)&local_188,&userConnectorConfig,(QString *)local_218,
               (QVariant *)&crtc_mode);
    QVariant::toByteArray();
    QVariant::~QVariant((QVariant *)&local_188);
    QVariant::~QVariant((QVariant *)&crtc_mode);
    if ((QArrayData *)local_218._0_8_ != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_218._0_8_ = *(int *)local_218._0_8_ + -1;
      UNLOCK();
      if (*(int *)local_218._0_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_218._0_8_,2,0x10);
      }
    }
    local_188._16_4_ = 0xaaaaaaaa;
    local_188._20_4_ = 0xaaaaaaaa;
    local_188._0_4_ = 0xaaaaaaaa;
    local_188._4_4_ = 0xaaaaaaaa;
    local_188._8_4_ = 0xaaaaaaaa;
    local_188._12_4_ = 0xaaaaaaaa;
    QByteArray::split((char)&local_188);
    if (CONCAT44(local_188._20_4_,local_188._16_4_) == 2) {
      QByteArray::trimmed_helper((QByteArray *)&crtc_mode);
      uVar31 = QByteArray::toInt((bool *)&crtc_mode,0);
      QByteArray::trimmed_helper((QByteArray *)local_218);
      lVar35 = QByteArray::toInt((bool *)local_218,0);
      vinfo->virtualPos = (QPoint)((ulong)uVar31 | lVar35 << 0x20);
      if ((QArrayData *)local_218._0_8_ != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_218._0_8_ = *(int *)local_218._0_8_ + -1;
        UNLOCK();
        if (*(int *)local_218._0_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_218._0_8_,1,0x10);
        }
      }
      if (crtc_mode._0_8_ != 0) {
        LOCK();
        *(int *)crtc_mode._0_8_ = *(int *)crtc_mode._0_8_ + -1;
        UNLOCK();
        if (*(int *)crtc_mode._0_8_ == 0) {
          QArrayData::deallocate((QArrayData *)crtc_mode._0_8_,1,0x10);
        }
      }
    }
    QArrayDataPointer<QByteArray>::~QArrayDataPointer((QArrayDataPointer<QByteArray> *)&local_188);
    piVar40 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
    if (piVar40 != (int *)0x0) {
      LOCK();
      *piVar40 = *piVar40 + -1;
      UNLOCK();
      if (*piVar40 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),1,0x10);
      }
    }
  }
  local_1f8._0_4_ = 0;
  local_1f8._4_4_ = 0;
  local_1f8._8_4_ = 0x149304;
  local_1f8._12_4_ = 0;
  local_1f8._16_4_ = 7;
  local_1f8._20_4_ = 0;
  crtc_mode.vsync_start = 0;
  crtc_mode.vsync_end = 0;
  crtc_mode.vtotal = 0;
  crtc_mode.vscan = 0;
  crtc_mode.clock = 0;
  crtc_mode.hdisplay = 0;
  crtc_mode.hsync_start = 0;
  crtc_mode.hsync_end = 0;
  crtc_mode.htotal = 0;
  crtc_mode.hskew = 0;
  crtc_mode.vdisplay = 0;
  crtc_mode.vrefresh = 2;
  crtc_mode.flags = 0;
  QMap<QString,_QVariant>::value
            ((QVariant *)&local_188,&userConnectorConfig,(QString *)&local_1f8,
             (QVariant *)&crtc_mode);
  cVar28 = QVariant::toBool();
  QVariant::~QVariant((QVariant *)&local_188);
  QVariant::~QVariant((QVariant *)&crtc_mode);
  piVar40 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
  if (piVar40 != (int *)0x0) {
    LOCK();
    *piVar40 = *piVar40 + -1;
    UNLOCK();
    if (*piVar40 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
    }
  }
  if (cVar28 != '\0') {
    vinfo->isPrimary = true;
  }
  uVar31 = resources->crtcs[uVar29];
  if (bVar26) {
    qLcKmsDebug();
    if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_188._0_4_ = 2;
      local_188._4_4_ = 0;
      local_188._8_4_ = 0;
      local_188._12_4_ = 0;
      local_188._16_4_ = 0;
      local_188._20_4_ = 0;
      uStack_170 = qLcKmsDebug::category.name;
      QMessageLogger::debug();
      pQVar44 = (QTextStream *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
      QVar62.m_data = (storage_type *)0x12;
      QVar62.m_size = (qsizetype)&crtc_mode;
      QString::fromUtf8(QVar62);
      QTextStream::operator<<(pQVar44,(QString *)&crtc_mode);
      if (crtc_mode._0_8_ != 0) {
        LOCK();
        *(int *)crtc_mode._0_8_ = *(int *)crtc_mode._0_8_ + -1;
        UNLOCK();
        if (*(int *)crtc_mode._0_8_ == 0) {
          QArrayData::deallocate((QArrayData *)crtc_mode._0_8_,2,0x10);
        }
      }
      if (((QTextStream *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_))[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),' ');
      }
      pcVar48 = connectorName.d.ptr;
      if (connectorName.d.ptr == (char *)0x0) {
        pcVar48 = (char *)&QByteArray::_empty;
      }
      QDebug::putByteArray
                ((char *)local_1f8.data,(ulong)pcVar48,(Latin1Content)connectorName.d.size);
      if (((QTextStream *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_))[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),' ');
      }
      QDebug::~QDebug((QDebug *)&local_1f8.shared);
    }
    pQVar46 = (QPlatformScreen *)0x0;
    drmModeSetCrtc(this->m_dri_fd,uVar31,0,0,0,0,0,0);
  }
  else {
    if ((bVar9) && (connector->connection == DRM_MODE_DISCONNECTED)) {
      qLcKmsDebug();
      if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        local_188._0_4_ = 2;
        local_188._4_4_ = 0;
        local_188._8_4_ = 0;
        local_188._12_4_ = 0;
        local_188._16_4_ = 0;
        local_188._20_4_ = 0;
        uStack_170 = qLcKmsDebug::category.name;
        QMessageLogger::debug();
        pQVar44 = (QTextStream *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
        psVar49 = (storage_type *)0x1c;
LAB_00132405:
        QVar63.m_data = psVar49;
        QVar63.m_size = (qsizetype)&crtc_mode;
        QString::fromUtf8(QVar63);
        QTextStream::operator<<(pQVar44,(QString *)&crtc_mode);
        if (crtc_mode._0_8_ != 0) {
          LOCK();
          *(int *)crtc_mode._0_8_ = *(int *)crtc_mode._0_8_ + -1;
          UNLOCK();
          if (*(int *)crtc_mode._0_8_ == 0) {
            QArrayData::deallocate((QArrayData *)crtc_mode._0_8_,2,0x10);
          }
        }
        if (((QTextStream *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_))[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),' ');
        }
        pcVar48 = connectorName.d.ptr;
        if (connectorName.d.ptr == (char *)0x0) {
          pcVar48 = (char *)&QByteArray::_empty;
        }
        QDebug::putByteArray
                  ((char *)local_1f8.data,(ulong)pcVar48,(Latin1Content)connectorName.d.size);
        if (((QTextStream *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_))[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),' ');
        }
        QDebug::~QDebug((QDebug *)&local_1f8.shared);
      }
    }
    else {
      if (!bVar27) {
        crtc_mode.clock = 0;
        crtc_mode.hdisplay = 0;
        crtc_mode.hsync_start = 0;
        crtc_mode.hsync_end = 0;
        crtc_mode.htotal = 0;
        crtc_mode.hskew = 0;
        crtc_mode.vdisplay = 0;
        crtc_mode.vsync_start = 0;
        crtc_mode.vsync_end = 0;
        crtc_mode.vtotal = 0;
        crtc_mode.vscan = 0;
        crtc_mode.vrefresh = 0;
        crtc_mode.flags = 0;
        crtc_mode.type = 0;
        crtc_mode.name[0] = '\0';
        crtc_mode.name[1] = '\0';
        crtc_mode.name[2] = '\0';
        crtc_mode.name[3] = '\0';
        crtc_mode.name[4] = '\0';
        crtc_mode.name[5] = '\0';
        crtc_mode.name[6] = '\0';
        crtc_mode.name[7] = '\0';
        crtc_mode.name[8] = '\0';
        crtc_mode.name[9] = '\0';
        crtc_mode.name[10] = '\0';
        crtc_mode.name[0xb] = '\0';
        crtc_mode.name[0xc] = '\0';
        crtc_mode.name[0xd] = '\0';
        crtc_mode.name[0xe] = '\0';
        crtc_mode.name[0xf] = '\0';
        crtc_mode.name[0x10] = '\0';
        crtc_mode.name[0x11] = '\0';
        crtc_mode.name[0x12] = '\0';
        crtc_mode.name[0x13] = '\0';
        crtc_mode.name[0x14] = '\0';
        crtc_mode.name[0x15] = '\0';
        crtc_mode.name[0x16] = '\0';
        crtc_mode.name[0x17] = '\0';
        crtc_mode.name[0x18] = '\0';
        crtc_mode.name[0x19] = '\0';
        crtc_mode.name[0x1a] = '\0';
        crtc_mode.name[0x1b] = '\0';
        crtc_mode.name[0x1c] = '\0';
        crtc_mode.name[0x1d] = '\0';
        crtc_mode.name[0x1e] = '\0';
        crtc_mode.name[0x1f] = '\0';
        lVar35 = drmModeGetEncoder(this->m_dri_fd,connector->encoder_id);
        if (lVar35 != 0) {
          lVar36 = drmModeGetCrtc(this->m_dri_fd,*(undefined4 *)(lVar35 + 8));
          drmModeFreeEncoder(lVar35);
          if (lVar36 == 0) goto LAB_00132b84;
          if (*(int *)(lVar36 + 0x18) != 0) {
            puVar50 = (uint32_t *)(lVar36 + 0x1c);
            pdVar52 = &crtc_mode;
            for (lVar35 = 0x11; lVar35 != 0; lVar35 = lVar35 + -1) {
              pdVar52->clock = *puVar50;
              puVar50 = puVar50 + (ulong)bVar59 * -2 + 1;
              pdVar52 = (drmModeModeInfo *)((long)pdVar52 + (ulong)bVar59 * -8 + 4);
            }
          }
          drmModeFreeCrtc(lVar36);
        }
        local_2b8.d.d = (Data *)0x0;
        local_2b8.d.ptr = (_drmModeModeInfo *)0x0;
        local_2b8.d.size = 0;
        QList<_drmModeModeInfo>::reserve(&local_2b8,(long)connector->count_modes);
        qLcKmsDebug();
        if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
        {
          local_188._0_4_ = 2;
          local_188._4_4_ = 0;
          local_188._8_4_ = 0;
          local_188._12_4_ = 0;
          local_188._16_4_ = 0;
          local_188._20_4_ = 0;
          uStack_170 = qLcKmsDebug::category.name;
          QMessageLogger::debug();
          pcVar48 = connectorName.d.ptr;
          if (connectorName.d.ptr == (char *)0x0) {
            pcVar48 = (char *)&QByteArray::_empty;
          }
          QDebug::putByteArray(local_218,(ulong)pcVar48,(Latin1Content)connectorName.d.size);
          if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                    super___atomic_base<int>._M_i == '\x01') {
            QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
          }
          uVar16 = local_218._0_8_;
          QVar64.m_data = (storage_type *)0xb;
          QVar64.m_size = (qsizetype)&local_1f8;
          QString::fromUtf8(QVar64);
          QTextStream::operator<<((QTextStream *)uVar16,(QString *)&local_1f8);
          piVar40 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
          if (piVar40 != (int *)0x0) {
            LOCK();
            *piVar40 = *piVar40 + -1;
            UNLOCK();
            if (*piVar40 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10)
              ;
            }
          }
          if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                    super___atomic_base<int>._M_i == '\x01') {
            QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
          }
          QTextStream::operator<<((QTextStream *)local_218._0_8_,connector->count_modes);
          if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                    super___atomic_base<int>._M_i == '\x01') {
            QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
          }
          uVar16 = local_218._0_8_;
          QVar65.m_data = (storage_type *)0xb;
          QVar65.m_size = (qsizetype)&local_1f8;
          QString::fromUtf8(QVar65);
          QTextStream::operator<<((QTextStream *)uVar16,(QString *)&local_1f8);
          piVar40 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
          if (piVar40 != (int *)0x0) {
            LOCK();
            *piVar40 = *piVar40 + -1;
            UNLOCK();
            if (*piVar40 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10)
              ;
            }
          }
          if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                    super___atomic_base<int>._M_i == '\x01') {
            QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
          }
          QTextStream::operator<<((QTextStream *)local_218._0_8_,uVar29);
          if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                    super___atomic_base<int>._M_i == '\x01') {
            QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
          }
          uVar16 = local_218._0_8_;
          QVar66.m_data = (storage_type *)0x8;
          QVar66.m_size = (qsizetype)&local_1f8;
          QString::fromUtf8(QVar66);
          QTextStream::operator<<((QTextStream *)uVar16,(QString *)&local_1f8);
          piVar40 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
          if (piVar40 != (int *)0x0) {
            LOCK();
            *piVar40 = *piVar40 + -1;
            UNLOCK();
            if (*piVar40 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10)
              ;
            }
          }
          if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                    super___atomic_base<int>._M_i == '\x01') {
            QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
          }
          QTextStream::operator<<((QTextStream *)local_218._0_8_,uVar31);
          if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                    super___atomic_base<int>._M_i == '\x01') {
            QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
          }
          QDebug::~QDebug((QDebug *)local_218);
        }
        if (0 < connector->count_modes) {
          lVar36 = 0;
          lVar35 = 0;
          do {
            p_Var5 = connector->modes;
            qLcKmsDebug();
            if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
                != 0) {
              local_188._0_4_ = 2;
              local_188._4_4_ = 0;
              local_188._8_4_ = 0;
              local_188._12_4_ = 0;
              local_188._16_4_ = 0;
              local_188._20_4_ = 0;
              uStack_170 = qLcKmsDebug::category.name;
              QMessageLogger::debug();
              uVar16 = local_218._0_8_;
              QVar67.m_data = (storage_type *)0x4;
              QVar67.m_size = (qsizetype)&local_1f8;
              QString::fromUtf8(QVar67);
              QTextStream::operator<<((QTextStream *)uVar16,(QString *)&local_1f8);
              piVar40 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
              if (piVar40 != (int *)0x0) {
                LOCK();
                *piVar40 = *piVar40 + -1;
                UNLOCK();
                if (*piVar40 == 0) {
                  QArrayData::deallocate
                            ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
                }
              }
              if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                        super___atomic_base<int>._M_i == '\x01') {
                QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
              }
              QTextStream::operator<<((QTextStream *)local_218._0_8_,(int)lVar35);
              if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                        super___atomic_base<int>._M_i == '\x01') {
                QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
              }
              QTextStream::operator<<
                        ((QTextStream *)local_218._0_8_,*(ushort *)(p_Var5->name + lVar36 + -0x20));
              if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                        super___atomic_base<int>._M_i == '\x01') {
                QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
              }
              uVar16 = local_218._0_8_;
              QVar68.m_data = (storage_type *)0x1;
              QVar68.m_size = (qsizetype)&local_1f8;
              QString::fromUtf8(QVar68);
              QTextStream::operator<<((QTextStream *)uVar16,(QString *)&local_1f8);
              piVar40 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
              if (piVar40 != (int *)0x0) {
                LOCK();
                *piVar40 = *piVar40 + -1;
                UNLOCK();
                if (*piVar40 == 0) {
                  QArrayData::deallocate
                            ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
                }
              }
              if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                        super___atomic_base<int>._M_i == '\x01') {
                QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
              }
              QTextStream::operator<<
                        ((QTextStream *)local_218._0_8_,*(ushort *)(p_Var5->name + lVar36 + -0x16));
              if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                        super___atomic_base<int>._M_i == '\x01') {
                QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
              }
              QTextStream::operator<<((QTextStream *)local_218._0_8_,'@');
              if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                        super___atomic_base<int>._M_i == '\x01') {
                QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
              }
              QTextStream::operator<<
                        ((QTextStream *)local_218._0_8_,*(uint *)(p_Var5->name + lVar36 + -0xc));
              if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                        super___atomic_base<int>._M_i == '\x01') {
                QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
              }
              uVar16 = local_218._0_8_;
              QVar69.m_data = (storage_type *)0x2;
              QVar69.m_size = (qsizetype)&local_1f8;
              QString::fromUtf8(QVar69);
              QTextStream::operator<<((QTextStream *)uVar16,(QString *)&local_1f8);
              piVar40 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
              if (piVar40 != (int *)0x0) {
                LOCK();
                *piVar40 = *piVar40 + -1;
                UNLOCK();
                if (*piVar40 == 0) {
                  QArrayData::deallocate
                            ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
                }
              }
              if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                        super___atomic_base<int>._M_i == '\x01') {
                QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
              }
              QDebug::~QDebug((QDebug *)local_218);
            }
            QtPrivate::QPodArrayOps<_drmModeModeInfo>::emplace<_drmModeModeInfo_const&>
                      ((QPodArrayOps<_drmModeModeInfo> *)&local_2b8,local_2b8.d.size,
                       (_drmModeModeInfo *)(connector->modes->name + lVar36 + -0x24));
            QList<_drmModeModeInfo>::end(&local_2b8);
            lVar35 = lVar35 + 1;
            lVar36 = lVar36 + 0x44;
          } while (lVar35 < connector->count_modes);
        }
        iVar30 = configurationRefresh;
        i = local_2b8.d.size;
        uVar32 = (int)local_2b8.d.size - 1;
        if ((int)uVar32 < 0) {
          uVar56 = 0xffffffff;
          local_3b0 = 0xffffffff;
          uVar54 = 0xffffffff;
          uVar32 = 0xffffffff;
        }
        else {
          RVar14.m_i = configurationSize.wd.m_i;
          RVar15.m_i = configurationSize.ht.m_i;
          __s2 = local_2b8.d.ptr + uVar32;
          uVar57 = 0xffffffff;
          uVar55 = 0xffffffff;
          local_3b0 = 0xffffffff;
          uVar45 = (ulong)uVar32;
          do {
            if (((bVar10) && (RVar14.m_i == (uint)__s2->hdisplay)) &&
               (RVar15.m_i == (uint)__s2->vdisplay)) {
              if (__s2->vrefresh == iVar30) {
                local_3b0 = (uint)uVar45;
              }
              if (iVar30 == 0) {
                local_3b0 = (uint)uVar45;
              }
            }
            iVar33 = bcmp(&crtc_mode,__s2,0x44);
            if (iVar33 == 0) {
              uVar55 = uVar45 & 0xffffffff;
            }
            uVar54 = (uint)uVar55;
            if ((__s2->type & 8) != 0) {
              uVar57 = uVar45 & 0xffffffff;
            }
            uVar32 = (uint)uVar57;
            __s2 = __s2 + -1;
            bVar26 = 0 < (long)uVar45;
            uVar45 = uVar45 - 1;
          } while (bVar26);
          uVar56 = 0;
        }
        if (bVar11) {
          QtPrivate::QPodArrayOps<_drmModeModeInfo>::emplace<_drmModeModeInfo_const&>
                    ((QPodArrayOps<_drmModeModeInfo> *)&local_2b8,i,&configurationModeline);
          QList<_drmModeModeInfo>::end(&local_2b8);
          local_3b0 = (int)local_2b8.d.size - 1;
        }
        if (((int)uVar54 < 0) && (crtc_mode.clock != 0)) {
          QtPrivate::QPodArrayOps<_drmModeModeInfo>::emplace<_drmModeModeInfo_const&>
                    ((QPodArrayOps<_drmModeModeInfo> *)&local_2b8,local_2b8.d.size,&crtc_mode);
          QList<_drmModeModeInfo>::end(&local_2b8);
          uVar54 = (int)local_2b8.d.size - 1;
        }
        if (bVar12) {
          local_3b0 = uVar54;
        }
        if ((((int)local_3b0 < 0) && (local_3b0 = uVar32, (int)uVar32 < 0)) &&
           (local_3b0 = uVar56, -1 < (int)uVar54)) {
          local_3b0 = uVar54;
        }
        if ((int)local_3b0 < 0) {
          createScreenForConnector((QKmsDevice *)&connectorName);
          pQVar46 = (QPlatformScreen *)0x0;
        }
        else {
          p_Var37 = QList<_drmModeModeInfo>::data(&local_2b8);
          uVar1 = p_Var37[local_3b0].hdisplay;
          p_Var37 = QList<_drmModeModeInfo>::data(&local_2b8);
          uVar2 = p_Var37[local_3b0].vdisplay;
          p_Var37 = QList<_drmModeModeInfo>::data(&local_2b8);
          uVar47 = p_Var37[local_3b0].vrefresh;
          qLcKmsDebug();
          if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
              0) {
            local_188._0_4_ = 2;
            local_188._4_4_ = 0;
            local_188._8_4_ = 0;
            local_188._12_4_ = 0;
            local_188._16_4_ = 0;
            local_188._20_4_ = 0;
            uStack_170 = qLcKmsDebug::category.name;
            QMessageLogger::debug();
            uVar16 = local_218._0_8_;
            QVar71.m_data = (storage_type *)0xd;
            QVar71.m_size = (qsizetype)&local_1f8;
            QString::fromUtf8(QVar71);
            QTextStream::operator<<((QTextStream *)uVar16,(QString *)&local_1f8);
            piVar40 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
            if (piVar40 != (int *)0x0) {
              LOCK();
              *piVar40 = *piVar40 + -1;
              UNLOCK();
              if (*piVar40 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
              }
            }
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            QTextStream::operator<<((QTextStream *)local_218._0_8_,local_3b0);
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            uVar16 = local_218._0_8_;
            QVar72.m_data = (storage_type *)0x1;
            QVar72.m_size = (qsizetype)&local_1f8;
            QString::fromUtf8(QVar72);
            QTextStream::operator<<((QTextStream *)uVar16,(QString *)&local_1f8);
            piVar40 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
            if (piVar40 != (int *)0x0) {
              LOCK();
              *piVar40 = *piVar40 + -1;
              UNLOCK();
              if (*piVar40 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
              }
            }
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            QTextStream::operator<<((QTextStream *)local_218._0_8_,(uint)uVar1);
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            uVar16 = local_218._0_8_;
            QVar73.m_data = (storage_type *)0x1;
            QVar73.m_size = (qsizetype)&local_1f8;
            QString::fromUtf8(QVar73);
            QTextStream::operator<<((QTextStream *)uVar16,(QString *)&local_1f8);
            piVar40 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
            if (piVar40 != (int *)0x0) {
              LOCK();
              *piVar40 = *piVar40 + -1;
              UNLOCK();
              if (*piVar40 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
              }
            }
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            QTextStream::operator<<((QTextStream *)local_218._0_8_,(uint)uVar2);
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            QTextStream::operator<<((QTextStream *)local_218._0_8_,'@');
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            QTextStream::operator<<((QTextStream *)local_218._0_8_,uVar47);
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            uVar16 = local_218._0_8_;
            QVar74.m_data = (storage_type *)0xd;
            QVar74.m_size = (qsizetype)&local_1f8;
            QString::fromUtf8(QVar74);
            QTextStream::operator<<((QTextStream *)uVar16,(QString *)&local_1f8);
            piVar40 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
            if (piVar40 != (int *)0x0) {
              LOCK();
              *piVar40 = *piVar40 + -1;
              UNLOCK();
              if (*piVar40 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
              }
            }
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            pcVar48 = connectorName.d.ptr;
            if (connectorName.d.ptr == (char *)0x0) {
              pcVar48 = (char *)&QByteArray::_empty;
            }
            QDebug::putByteArray(local_218,(ulong)pcVar48,(Latin1Content)connectorName.d.size);
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            QDebug::~QDebug((QDebug *)local_218);
          }
          iVar30 = qEnvironmentVariableIntValue("QT_QPA_EGLFS_PHYSICAL_WIDTH",(bool *)0x0);
          if (iVar30 == 0) {
            iVar30 = qEnvironmentVariableIntValue("QT_QPA_PHYSICAL_WIDTH",(bool *)0x0);
          }
          iVar33 = qEnvironmentVariableIntValue("QT_QPA_EGLFS_PHYSICAL_HEIGHT",(bool *)0x0);
          if (iVar33 == 0) {
            iVar33 = qEnvironmentVariableIntValue("QT_QPA_PHYSICAL_HEIGHT",(bool *)0x0);
          }
          local_2c8 = (Data *)(double)iVar30;
          pQStack_2c0 = (QKmsPlane *)(double)iVar33;
          if (iVar30 < 1 || iVar33 < 1) {
            auStack_300._24_8_ = (QArrayData *)0x0;
            auStack_300._32_8_ = L"physicalWidth";
            local_2d8 = (undefined1 *)0xd;
            local_1f8._16_4_ = 0;
            local_1f8._20_4_ = 0;
            local_1f8._0_4_ = 0;
            local_1f8._4_4_ = 0;
            local_1f8._8_4_ = 0;
            local_1f8._12_4_ = 0;
            local_1e0 = (char *)0x2;
            QMap<QString,_QVariant>::value
                      ((QVariant *)&local_188,&userConnectorConfig,(QString *)(auStack_300 + 0x18),
                       (QVariant *)&local_1f8);
            iVar30 = QVariant::toInt((bool *)local_188.data);
            local_310._8_8_ = (QArrayData *)0x0;
            auStack_300._0_8_ = L"physicalHeight";
            auStack_300._8_8_ = (QKmsScreenConfig *)0xe;
            local_238._16_8_ = (undefined1 *)0x0;
            local_238._0_8_ = (QArrayData *)0x0;
            local_238._8_8_ = (char16_t *)0x0;
            local_220 = (Data *)0x2;
            QMap<QString,_QVariant>::value
                      ((QVariant *)local_218,&userConnectorConfig,(QString *)(local_310 + 8),
                       (QVariant *)local_238);
            iVar33 = QVariant::toInt((bool *)local_218);
            local_2c8 = (Data *)(double)iVar30;
            pQStack_2c0 = (QKmsPlane *)(double)iVar33;
            QVariant::~QVariant((QVariant *)local_218);
            QVariant::~QVariant((QVariant *)local_238);
            if ((QArrayData *)local_310._8_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_310._8_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_310._8_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_310._8_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_310._8_8_,2,0x10);
              }
            }
            QVariant::~QVariant((QVariant *)&local_188);
            QVariant::~QVariant((QVariant *)&local_1f8);
            if ((QArrayData *)auStack_300._24_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)auStack_300._24_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)auStack_300._24_8_)->_q_value).super___atomic_base<int>._M_i
                   + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)auStack_300._24_8_)->_q_value).super___atomic_base<int>._M_i
                  == 0) {
                QArrayData::deallocate((QArrayData *)auStack_300._24_8_,2,0x10);
              }
            }
            if (((double)local_2c8 <= 0.0) || ((double)pQStack_2c0 <= 0.0)) {
              uVar45._0_4_ = connector->mmWidth;
              uVar45._4_4_ = connector->mmHeight;
              auVar60._0_8_ = uVar45 & 0xffffffff;
              auVar60._8_4_ = uVar45._4_4_;
              auVar60._12_4_ = 0;
              local_2c8 = (Data *)(SUB168(auVar60 | _DAT_00148660,0) - (double)DAT_00148660);
              pQStack_2c0 = (QKmsPlane *)(SUB168(auVar60 | _DAT_00148660,8) - DAT_00148660._8_8_);
            }
          }
          qLcKmsDebug();
          if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
              0) {
            local_188._0_4_ = 2;
            local_188._4_4_ = 0;
            local_188._8_4_ = 0;
            local_188._12_4_ = 0;
            local_188._16_4_ = 0;
            local_188._20_4_ = 0;
            uStack_170 = qLcKmsDebug::category.name;
            QMessageLogger::debug();
            uVar16 = local_238._0_8_;
            QVar75.m_data = (storage_type *)0x10;
            QVar75.m_size = (qsizetype)&local_1f8;
            QString::fromUtf8(QVar75);
            QTextStream::operator<<((QTextStream *)uVar16,(QString *)&local_1f8);
            piVar40 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
            if (piVar40 != (int *)0x0) {
              LOCK();
              *piVar40 = *piVar40 + -1;
              UNLOCK();
              if (*piVar40 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
              }
            }
            if ((char)(((QArrayData *)(local_238._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_238._0_8_,' ');
            }
            local_310._0_8_ = local_238._0_8_;
            *(int *)(local_238._0_8_ + 0x28) = *(int *)(local_238._0_8_ + 0x28) + 1;
            ::operator<<((Stream *)local_218,(QSizeF *)local_310);
            uVar16 = local_218._0_8_;
            QVar76.m_data = (storage_type *)0x2;
            QVar76.m_size = (qsizetype)&local_1f8;
            QString::fromUtf8(QVar76);
            QTextStream::operator<<((QTextStream *)uVar16,(QString *)&local_1f8);
            piVar40 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
            if (piVar40 != (int *)0x0) {
              LOCK();
              *piVar40 = *piVar40 + -1;
              UNLOCK();
              if (*piVar40 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
              }
            }
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            uVar16 = local_218._0_8_;
            QVar77.m_data = (storage_type *)0xa;
            QVar77.m_size = (qsizetype)&local_1f8;
            QString::fromUtf8(QVar77);
            QTextStream::operator<<((QTextStream *)uVar16,(QString *)&local_1f8);
            piVar40 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
            if (piVar40 != (int *)0x0) {
              LOCK();
              *piVar40 = *piVar40 + -1;
              UNLOCK();
              if (*piVar40 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
              }
            }
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            pcVar48 = connectorName.d.ptr;
            if (connectorName.d.ptr == (char *)0x0) {
              pcVar48 = (char *)&QByteArray::_empty;
            }
            QDebug::putByteArray(local_218,(ulong)pcVar48,(Latin1Content)connectorName.d.size);
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            QDebug::~QDebug((QDebug *)local_218);
            QDebug::~QDebug((QDebug *)local_310);
            QDebug::~QDebug((QDebug *)local_238);
          }
          local_238._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_238._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_238._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          auStack_300._24_8_ = (QArrayData *)0x0;
          auStack_300._32_8_ = L"format";
          local_2d8 = (undefined1 *)0x6;
          auStack_300._8_8_ = (QKmsScreenConfig *)0x0;
          local_310._8_8_ = (QArrayData *)0x0;
          auStack_300._0_8_ = (_func_int **)0x0;
          QVariant::QVariant((QVariant *)&local_1f8,(QString *)(local_310 + 8));
          QMap<QString,_QVariant>::value
                    ((QVariant *)&local_188,&userConnectorConfig,(QString *)(auStack_300 + 0x18),
                     (QVariant *)&local_1f8);
          QVariant::toByteArray();
          QByteArray::toLower_helper((QByteArray *)local_238);
          if ((QArrayData *)local_218._0_8_ != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_218._0_8_ = *(int *)local_218._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_218._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_218._0_8_,1,0x10);
            }
          }
          QVariant::~QVariant((QVariant *)&local_188);
          QVariant::~QVariant((QVariant *)&local_1f8);
          if ((QArrayData *)local_310._8_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_310._8_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_310._8_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_310._8_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_310._8_8_,2,0x10);
            }
          }
          if ((QArrayData *)auStack_300._24_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)auStack_300._24_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)auStack_300._24_8_)->_q_value).super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)auStack_300._24_8_)->_q_value).super___atomic_base<int>._M_i ==
                0) {
              QArrayData::deallocate((QArrayData *)auStack_300._24_8_,2,0x10);
            }
          }
          uVar56 = 0x34325258;
          if ((undefined1 *)local_238._16_8_ == (undefined1 *)0x0) {
            cVar28 = '\0';
          }
          else {
            local_188._0_4_ = 0x148816;
            local_188._4_4_ = 0;
            bVar26 = operator==((QByteArray *)local_238,(char **)&local_188.shared);
            cVar28 = '\x01';
            if (!bVar26) {
              local_188._0_4_ = 0x14881f;
              local_188._4_4_ = 0;
              bVar26 = operator==((QByteArray *)local_238,(char **)&local_188.shared);
              uVar56 = 0x34324258;
              if (!bVar26) {
                local_188._0_4_ = 0x148828;
                local_188._4_4_ = 0;
                bVar26 = operator==((QByteArray *)local_238,(char **)&local_188.shared);
                uVar56 = 0x34325241;
                if (!bVar26) {
                  local_188._0_4_ = 0x148831;
                  local_188._4_4_ = 0;
                  bVar26 = operator==((QByteArray *)local_238,(char **)&local_188.shared);
                  uVar56 = 0x34324241;
                  if (!bVar26) {
                    local_188._0_4_ = 0x14883a;
                    local_188._4_4_ = 0;
                    bVar26 = operator==((QByteArray *)local_238,(char **)&local_188.shared);
                    uVar56 = 0x36314752;
                    if (!bVar26) {
                      local_188._0_4_ = 0x148841;
                      local_188._4_4_ = 0;
                      bVar26 = operator==((QByteArray *)local_238,(char **)&local_188.shared);
                      uVar56 = 0x36314742;
                      if (!bVar26) {
                        local_188._0_4_ = 0x148848;
                        local_188._4_4_ = 0;
                        bVar26 = operator==((QByteArray *)local_238,(char **)&local_188.shared);
                        uVar56 = 0x30335258;
                        if (!bVar26) {
                          local_188._0_4_ = 0x148854;
                          local_188._4_4_ = 0;
                          bVar26 = operator==((QByteArray *)local_238,(char **)&local_188.shared);
                          uVar56 = 0x30334258;
                          if (!bVar26) {
                            local_188._0_4_ = 0x148860;
                            local_188._4_4_ = 0;
                            bVar26 = operator==((QByteArray *)local_238,(char **)&local_188.shared);
                            uVar56 = 0x30335241;
                            if (!bVar26) {
                              local_188._0_4_ = 0x14886c;
                              local_188._4_4_ = 0;
                              bVar26 = operator==((QByteArray *)local_238,(char **)&local_188.shared
                                                 );
                              uVar56 = 0x30334241;
                              if (!bVar26) {
                                createScreenForConnector();
                                cVar28 = '\0';
                                uVar56 = 0x34325258;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          qLcKmsDebug();
          if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
              0) {
            local_188._0_4_ = 2;
            local_188._4_4_ = 0;
            local_188._8_4_ = 0;
            local_188._12_4_ = 0;
            local_188._16_4_ = 0;
            local_188._20_4_ = 0;
            uStack_170 = qLcKmsDebug::category.name;
            QMessageLogger::debug();
            uVar16 = local_218._0_8_;
            QVar78.m_data = &DAT_00000009;
            QVar78.m_size = (qsizetype)&local_1f8;
            QString::fromUtf8(QVar78);
            QTextStream::operator<<((QTextStream *)uVar16,(QString *)&local_1f8);
            piVar40 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
            if (piVar40 != (int *)0x0) {
              LOCK();
              *piVar40 = *piVar40 + -1;
              UNLOCK();
              if (*piVar40 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
              }
            }
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            Qt::hex((QTextStream *)local_218._0_8_);
            QTextStream::operator<<((QTextStream *)local_218._0_8_,uVar56);
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            Qt::dec((QTextStream *)local_218._0_8_);
            uVar16 = local_218._0_8_;
            QVar79.m_data = (storage_type *)0x13;
            QVar79.m_size = (qsizetype)&local_1f8;
            QString::fromUtf8(QVar79);
            QTextStream::operator<<((QTextStream *)uVar16,(QString *)&local_1f8);
            piVar40 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
            if (piVar40 != (int *)0x0) {
              LOCK();
              *piVar40 = *piVar40 + -1;
              UNLOCK();
              if (*piVar40 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
              }
            }
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            pcVar48 = "false";
            if (cVar28 != '\0') {
              pcVar48 = "true";
            }
            QTextStream::operator<<((QTextStream *)local_218._0_8_,pcVar48);
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            uVar16 = local_218._0_8_;
            QVar80.m_data = (storage_type *)0xa;
            QVar80.m_size = (qsizetype)&local_1f8;
            QString::fromUtf8(QVar80);
            QTextStream::operator<<((QTextStream *)uVar16,(QString *)&local_1f8);
            piVar40 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
            if (piVar40 != (int *)0x0) {
              LOCK();
              *piVar40 = *piVar40 + -1;
              UNLOCK();
              if (*piVar40 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
              }
            }
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            pcVar48 = connectorName.d.ptr;
            if (connectorName.d.ptr == (char *)0x0) {
              pcVar48 = (char *)&QByteArray::_empty;
            }
            QDebug::putByteArray(local_218,(ulong)pcVar48,(Latin1Content)connectorName.d.size);
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            QDebug::~QDebug((QDebug *)local_218);
          }
          local_2d8 = &DAT_aaaaaaaaaaaaaaaa;
          auStack_300._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
          auStack_300._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_218._0_8_ = (QArrayData *)0x0;
          local_218._8_8_ = L"clones";
          local_218._16_8_ = 6;
          local_1f8._16_4_ = 0;
          local_1f8._20_4_ = 0;
          local_1f8._0_4_ = 0;
          local_1f8._4_4_ = 0;
          local_1f8._8_4_ = 0;
          local_1f8._12_4_ = 0;
          local_1e0 = (char *)0x2;
          QMap<QString,_QVariant>::value
                    ((QVariant *)&local_188,&userConnectorConfig,(QString *)local_218,
                     (QVariant *)&local_1f8);
          QVariant::toString();
          QVariant::~QVariant((QVariant *)&local_188);
          QVariant::~QVariant((QVariant *)&local_1f8);
          if ((QArrayData *)local_218._0_8_ != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_218._0_8_ = *(int *)local_218._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_218._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_218._0_8_,2,0x10);
            }
          }
          if ((local_2d8 != (undefined1 *)0x0) &&
             (qLcKmsDebug(),
             ((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0
             )) {
            local_188._0_4_ = 2;
            local_188._4_4_ = 0;
            local_188._8_4_ = 0;
            local_188._12_4_ = 0;
            local_188._16_4_ = 0;
            local_188._20_4_ = 0;
            uStack_170 = qLcKmsDebug::category.name;
            QMessageLogger::debug();
            uVar16 = local_218._0_8_;
            QVar81.m_data = (storage_type *)0x6;
            QVar81.m_size = (qsizetype)&local_1f8;
            QString::fromUtf8(QVar81);
            QTextStream::operator<<((QTextStream *)uVar16,(QString *)&local_1f8);
            piVar40 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
            if (piVar40 != (int *)0x0) {
              LOCK();
              *piVar40 = *piVar40 + -1;
              UNLOCK();
              if (*piVar40 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
              }
            }
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            pcVar48 = connectorName.d.ptr;
            if (connectorName.d.ptr == (char *)0x0) {
              pcVar48 = (char *)&QByteArray::_empty;
            }
            QDebug::putByteArray(local_218,(ulong)pcVar48,(Latin1Content)connectorName.d.size);
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            uVar16 = local_218._0_8_;
            QVar82.m_data = (storage_type *)0xf;
            QVar82.m_size = (qsizetype)&local_1f8;
            QString::fromUtf8(QVar82);
            QTextStream::operator<<((QTextStream *)uVar16,(QString *)&local_1f8);
            piVar40 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
            if (piVar40 != (int *)0x0) {
              LOCK();
              *piVar40 = *piVar40 + -1;
              UNLOCK();
              if (*piVar40 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
              }
            }
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            pcVar51 = (char16_t *)auStack_300._32_8_;
            if ((char16_t *)auStack_300._32_8_ == (char16_t *)0x0) {
              pcVar51 = (char16_t *)&QString::_empty;
            }
            QDebug::putString((QChar *)local_218,(ulong)pcVar51);
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            QDebug::~QDebug((QDebug *)local_218);
          }
          framebufferSize.wd.m_i = -1;
          framebufferSize.ht.m_i = -1;
          auStack_300._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_310._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          auStack_300._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_338.d.d = (Data *)0x0;
          local_338.d.ptr = L"size";
          local_338.d.size = 4;
          local_1f8._16_4_ = 0;
          local_1f8._20_4_ = 0;
          local_1f8._0_4_ = 0;
          local_1f8._4_4_ = 0;
          local_1f8._8_4_ = 0;
          local_1f8._12_4_ = 0;
          local_1e0 = (char *)0x2;
          QMap<QString,_QVariant>::value
                    ((QVariant *)&local_188,&userConnectorConfig,&local_338,(QVariant *)&local_1f8);
          QVariant::toByteArray();
          QByteArray::toLower_helper((QByteArray *)(local_310 + 8));
          if ((QArrayData *)local_218._0_8_ != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_218._0_8_ = *(int *)local_218._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_218._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_218._0_8_,1,0x10);
            }
          }
          QVariant::~QVariant((QVariant *)&local_188);
          QVariant::~QVariant((QVariant *)&local_1f8);
          if (&(local_338.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_338.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_338.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_338.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_338.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((QKmsScreenConfig *)auStack_300._8_8_ == (QKmsScreenConfig *)0x0) {
LAB_00133feb:
            cVar43 = '\0';
          }
          else {
            pp_Var53 = (_func_int **)auStack_300._0_8_;
            if ((_func_int **)auStack_300._0_8_ == (_func_int **)0x0) {
              pp_Var53 = (_func_int **)&QByteArray::_empty;
            }
            iVar30 = __isoc99_sscanf(pp_Var53,"%dx%d",&framebufferSize,&framebufferSize.ht);
            if (iVar30 != 2) {
              createScreenForConnector((QKmsDevice *)auStack_300);
              goto LAB_00133feb;
            }
            cVar43 = this->m_has_atomic_support;
            if ((bool)cVar43 == false) {
              createScreenForConnector();
            }
          }
          if (cVar43 == '\0') {
            p_Var37 = QList<_drmModeModeInfo>::data(&local_2b8);
            QVar13 = framebufferSize;
            framebufferSize.wd.m_i._2_2_ = 0;
            framebufferSize.wd.m_i._0_2_ = p_Var37[local_3b0].hdisplay;
            framebufferSize.ht = QVar13.ht.m_i;
            p_Var37 = QList<_drmModeModeInfo>::data(&local_2b8);
            framebufferSize.ht.m_i._0_2_ = p_Var37[local_3b0].vdisplay;
            framebufferSize.ht.m_i._2_2_ = 0;
          }
          qLcKmsDebug();
          if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
              0) {
            local_188._0_4_ = 2;
            local_188._4_4_ = 0;
            local_188._8_4_ = 0;
            local_188._12_4_ = 0;
            local_188._16_4_ = 0;
            local_188._20_4_ = 0;
            uStack_170 = qLcKmsDebug::category.name;
            QMessageLogger::debug();
            uVar16 = local_218._0_8_;
            QVar83.m_data = (storage_type *)0x6;
            QVar83.m_size = (qsizetype)&local_1f8;
            QString::fromUtf8(QVar83);
            QTextStream::operator<<((QTextStream *)uVar16,(QString *)&local_1f8);
            piVar40 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
            if (piVar40 != (int *)0x0) {
              LOCK();
              *piVar40 = *piVar40 + -1;
              UNLOCK();
              if (*piVar40 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
              }
            }
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            pcVar48 = connectorName.d.ptr;
            if (connectorName.d.ptr == (char *)0x0) {
              pcVar48 = (char *)&QByteArray::_empty;
            }
            QDebug::putByteArray(local_218,(ulong)pcVar48,(Latin1Content)connectorName.d.size);
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            uVar16 = local_218._0_8_;
            QVar84.m_data = (storage_type *)0x14;
            QVar84.m_size = (qsizetype)&local_1f8;
            QString::fromUtf8(QVar84);
            QTextStream::operator<<((QTextStream *)uVar16,(QString *)&local_1f8);
            piVar40 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
            if (piVar40 != (int *)0x0) {
              LOCK();
              *piVar40 = *piVar40 + -1;
              UNLOCK();
              if (*piVar40 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
              }
            }
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            local_348.wd.m_i = local_218._0_4_;
            local_348.ht.m_i = local_218._4_4_;
            *(int *)(local_218._0_8_ + 0x28) = *(int *)(local_218._0_8_ + 0x28) + 1;
            ::operator<<((Stream *)local_340,&local_348);
            QDebug::~QDebug((QDebug *)local_340);
            QDebug::~QDebug((QDebug *)&local_348);
            QDebug::~QDebug((QDebug *)local_218);
          }
          memcpy(&local_188,&DAT_00149378,0xe8);
          local_188._0_4_ = 0;
          local_188._4_4_ = 0;
          local_188._8_4_ = 0;
          local_188._12_4_ = 0;
          local_188._16_4_ = 0;
          local_188._20_4_ = 0;
          uStack_170 = (char *)0x0;
          local_168 = local_168 & 0xffffffff00000000;
          local_160 = (Data *)0xbff0000000000000;
          pQStack_158 = (QKmsPlane *)0xbff0000000000000;
          local_150 = 0xffffffffffffffff;
          uStack_148 = uStack_148 & 0xffffffffffffff00;
          local_140 = (drmModeCrtcPtr)0x0;
          auStack_138._0_8_ = (QArrayData *)0x0;
          auStack_138._8_8_ = (_drmModeModeInfo *)0x0;
          auStack_138._16_8_ = 0;
          local_120 = CONCAT44(local_120._4_4_,1);
          uStack_104 = 0;
          uStack_100 = uStack_100 & 0xffffff00;
          p_Stack_118 = (drmModePropertyPtr)0x0;
          local_110 = (drmModePropertyBlobPtr)0x0;
          uStack_108 = uStack_108 & 0xffffff00;
          uStack_fc = 0x34325258;
          uStack_f8 = uStack_f8 & 0xffffff00;
          QStack_f0.d.d._0_4_ = 0;
          QStack_f0.d.d._4_4_ = 0;
          QStack_f0.d.ptr._0_1_ = 0;
          QStack_f0.d.ptr._1_7_ = 0;
          QStack_f0.d.size = 0;
          auStack_d8._0_8_ = (Data *)0x0;
          auStack_d8._8_8_ = (QKmsPlane *)0x0;
          auStack_d8._16_8_ = 0;
          local_c0 = (QKmsPlane *)0x0;
          QStack_b8.wd.m_i = -1;
          QStack_b8.ht.m_i = -1;
          local_b0 = (QKmsPlane *)0x0;
          QStack_a8.wd.m_i = 0;
          QStack_a8.ht.m_i = 0;
          QVar85.m_data = (storage_type *)connectorName.d.size;
          QVar85.m_size = (qsizetype)&local_1f8;
          QString::fromUtf8(QVar85);
          uVar24 = local_188._12_4_;
          uVar23 = local_188._8_4_;
          uVar22 = local_188._4_4_;
          uVar21 = local_188._0_4_;
          uVar20 = local_1f8._20_4_;
          uVar19 = local_1f8._16_4_;
          uVar18 = local_1f8._4_4_;
          uVar17 = local_1f8._0_4_;
          piVar40 = (int *)CONCAT44(local_188._4_4_,local_188._0_4_);
          local_1f8._0_4_ = local_188._0_4_;
          local_1f8._4_4_ = local_188._4_4_;
          local_188._0_4_ = uVar17;
          local_188._4_4_ = uVar18;
          local_188._8_4_ = local_1f8._8_4_;
          local_188._12_4_ = local_1f8._12_4_;
          local_1f8._8_4_ = uVar23;
          local_1f8._12_4_ = uVar24;
          local_1f8._16_4_ = local_188._16_4_;
          local_1f8._20_4_ = local_188._20_4_;
          local_188._16_4_ = uVar19;
          local_188._20_4_ = uVar20;
          if (piVar40 != (int *)0x0) {
            LOCK();
            *piVar40 = *piVar40 + -1;
            UNLOCK();
            if (*piVar40 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(uVar22,uVar21),2,0x10);
            }
          }
          uStack_170 = (char *)CONCAT44(uVar29,connector->connector_id);
          local_168 = CONCAT44(local_168._4_4_,uVar31);
          local_160 = local_2c8;
          pQStack_158 = pQStack_2c0;
          if ((int)uVar32 < 0) {
            uVar32 = local_3b0;
          }
          local_150 = CONCAT44(local_3b0,uVar32);
          uStack_148 = uStack_148 & 0xffffffffffffff00;
          local_140 = (drmModeCrtcPtr)drmModeGetCrtc(this->m_dri_fd);
          uVar16 = auStack_138._0_8_;
          if (&(local_2b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_2b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_2b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1
            ;
            UNLOCK();
          }
          auStack_138._0_8_ = local_2b8.d.d;
          auStack_138._8_8_ = local_2b8.d.ptr;
          auStack_138._16_8_ = local_2b8.d.size;
          if ((QArrayData *)uVar16 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar16)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar16)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)uVar16)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)uVar16,0x44,0x10);
            }
          }
          local_120 = CONCAT44(local_120._4_4_,connector->subpixel);
          local_1f8._0_4_ = 0;
          local_1f8._4_4_ = 0;
          local_1f8._8_4_ = 0x148947;
          local_1f8._12_4_ = 0;
          local_1f8._16_4_ = 4;
          local_1f8._20_4_ = 0;
          p_Stack_118 = connectorProperty(this,connector,(QByteArray *)&local_1f8);
          local_1f8._0_4_ = 0;
          local_1f8._4_4_ = 0;
          local_1f8._8_4_ = 0x14894c;
          local_1f8._12_4_ = 0;
          local_1f8._16_4_ = 4;
          local_1f8._20_4_ = 0;
          local_110 = connectorPropertyBlob(this,connector,(QByteArray *)&local_1f8);
          uStack_108 = uStack_108 & 0xffffff00;
          uStack_104 = 0;
          uStack_100 = uStack_100 & 0xffffff00;
          uStack_f8 = CONCAT31(uStack_f8._1_3_,cVar28);
          uStack_fc = uVar56;
          QString::operator=(&QStack_f0,(QString *)(auStack_300 + 0x18));
          QStack_b8 = framebufferSize;
          iVar30 = this->m_dri_fd;
          p_Var37 = QList<_drmModeModeInfo>::data(&local_2b8);
          iVar30 = drmModeCreatePropertyBlob(iVar30,p_Var37 + local_3b0,0x44,&QStack_a8.ht);
          if ((iVar30 != 0) &&
             (qLcKmsDebug(),
             ((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0
             )) {
            local_1f8._0_4_ = 2;
            local_1f8._4_4_ = 0;
            local_1f8._8_4_ = 0;
            local_1f8._12_4_ = 0;
            local_1f8._16_4_ = 0;
            local_1f8._20_4_ = 0;
            local_1e0 = qLcKmsDebug::category.name;
            QMessageLogger::debug();
            pDVar6 = local_338.d.d;
            QVar86.m_data = (storage_type *)0x23;
            QVar86.m_size = (qsizetype)local_218;
            QString::fromUtf8(QVar86);
            QTextStream::operator<<((QTextStream *)pDVar6,(QString *)local_218);
            if ((QArrayData *)local_218._0_8_ != (QArrayData *)0x0) {
              LOCK();
              *(int *)local_218._0_8_ = *(int *)local_218._0_8_ + -1;
              UNLOCK();
              if (*(int *)local_218._0_8_ == 0) {
                QArrayData::deallocate((QArrayData *)local_218._0_8_,2,0x10);
              }
            }
            if ((char)local_338.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i
                == '\x01') {
              QTextStream::operator<<((QTextStream *)local_338.d.d,' ');
            }
            QTextStream::operator<<((QTextStream *)local_338.d.d,local_3b0);
            if ((char)local_338.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i
                == '\x01') {
              QTextStream::operator<<((QTextStream *)local_338.d.d,' ');
            }
            QDebug::~QDebug((QDebug *)&local_338);
          }
          parseConnectorProperties(this,(uint32_t)uStack_170,(QKmsOutput *)&local_188);
          parseCrtcProperties(this,(uint32_t)local_168,(QKmsOutput *)&local_188);
          local_218._0_8_ = (QArrayData *)0x0;
          local_218._8_8_ = (char16_t *)0x0;
          local_218._16_8_ = 0;
          this_00 = &this->m_planes;
          iVar38 = QList<QKmsPlane>::begin(this_00);
          iVar39 = QList<QKmsPlane>::end(this_00);
          if (iVar38.i != iVar39.i) {
            do {
              if (((uint)(iVar38.i)->possibleCrtcs >> (uStack_170._4_4_ & 0x1f) & 1) != 0) {
                QtPrivate::QGenericArrayOps<QKmsPlane>::emplace<QKmsPlane_const&>
                          ((QGenericArrayOps<QKmsPlane> *)auStack_d8,auStack_d8._16_8_,iVar38.i);
                QList<QKmsPlane>::end((QList<QKmsPlane> *)auStack_d8);
                QString::number((uint)&local_1f8,(iVar38.i)->id);
                QString::append((QString *)local_218);
                piVar40 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
                if (piVar40 != (int *)0x0) {
                  LOCK();
                  *piVar40 = *piVar40 + -1;
                  UNLOCK();
                  if (*piVar40 == 0) {
                    QArrayData::deallocate
                              ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
                  }
                }
                QString::append((QChar)(char16_t)(QString *)local_218);
                if (((local_c0 == (QKmsPlane *)0x0) && ((iVar38.i)->type == PrimaryPlane)) &&
                   ((iVar38.i)->activeCrtcId == 0)) {
                  (iVar38.i)->activeCrtcId = (uint32_t)local_168;
                  local_c0 = iVar38.i;
                }
              }
              iVar38.i = iVar38.i + 1;
            } while (iVar38.i != iVar39.i);
          }
          qLcKmsDebug();
          uVar16 = auStack_d8._16_8_;
          if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
              0) {
            local_1f8._0_4_ = 2;
            local_1f8._4_4_ = 0;
            local_1f8._8_4_ = 0;
            local_1f8._12_4_ = 0;
            local_1f8._16_4_ = 0;
            local_1f8._20_4_ = 0;
            pcVar48 = connectorName.d.ptr;
            if (connectorName.d.ptr == (char *)0x0) {
              pcVar48 = (char *)&QByteArray::_empty;
            }
            local_1e0 = qLcKmsDebug::category.name;
            QString::toLocal8Bit_helper((QChar *)&local_338,local_218._8_8_);
            pcVar51 = local_338.d.ptr;
            if (local_338.d.ptr == (char16_t *)0x0) {
              pcVar51 = (char16_t *)&QByteArray::_empty;
            }
            QMessageLogger::debug
                      ((char *)local_1f8.data,"Output %s can use %d planes: %s",pcVar48,
                       uVar16 & 0xffffffff,pcVar51);
            if (&(local_338.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_338.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_338.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_338.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_338.d.d)->super_QArrayData,1,0x10);
              }
            }
          }
          ok = true;
          uVar29 = qEnvironmentVariableIntValue("QT_QPA_EGLFS_KMS_PLANE_INDEX",&ok);
          if (ok != false) {
            piVar40 = (int *)drmModeGetPlaneResources(this->m_dri_fd);
            if (piVar40 != (int *)0x0) {
              if (((int)uVar29 < 0) || (*piVar40 <= (int)uVar29)) {
                local_1f8._0_4_ = 2;
                local_1f8._4_4_ = 0;
                local_1f8._8_4_ = 0;
                local_1f8._12_4_ = 0;
                local_1f8._16_4_ = 0;
                local_1f8._20_4_ = 0;
                local_1e0 = "default";
                QMessageLogger::warning
                          ((char *)local_1f8.data,"Invalid plane index %d, must be between 0 and %u"
                           ,(ulong)uVar29,(ulong)(*piVar40 - 1));
              }
              else {
                lVar35 = drmModeGetPlane(this->m_dri_fd,
                                         *(undefined4 *)(*(long *)(piVar40 + 2) + (ulong)uVar29 * 4)
                                        );
                if (lVar35 != 0) {
                  uStack_108 = CONCAT31(uStack_108._1_3_,1);
                  uStack_104 = *(uint32_t *)(lVar35 + 0x10);
                  qLcKmsDebug();
                  if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i
                      & 1) != 0) {
                    local_1f8._0_4_ = 2;
                    local_1f8._4_4_ = 0;
                    local_1f8._8_4_ = 0;
                    local_1f8._12_4_ = 0;
                    local_1f8._16_4_ = 0;
                    local_1f8._20_4_ = 0;
                    local_1e0 = qLcKmsDebug::category.name;
                    QMessageLogger::debug
                              ((char *)local_1f8.data,
                               "Forcing plane index %d, plane id %u (belongs to crtc id %u)",
                               (ulong)uVar29,(ulong)*(uint *)(lVar35 + 0x10),
                               (ulong)*(uint *)(lVar35 + 0x14));
                  }
                  iVar38 = QList<QKmsPlane>::begin(this_00);
                  iVar39 = QList<QKmsPlane>::end(this_00);
                  for (; iVar38.i != iVar39.i; iVar38.i = iVar38.i + 1) {
                    if ((iVar38.i)->id == uStack_104) {
                      if (local_c0 != (QKmsPlane *)0x0) {
                        local_c0->activeCrtcId = 0;
                      }
                      (iVar38.i)->activeCrtcId = (uint32_t)local_168;
                      local_c0 = iVar38.i;
                      break;
                    }
                  }
                  drmModeFreePlane(lVar35);
                }
              }
            }
          }
          cVar28 = qEnvironmentVariableIsSet("QT_QPA_EGLFS_KMS_PLANES_FOR_CRTCS");
          if (cVar28 != '\0') {
            local_338.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_338.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_338.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            qEnvironmentVariable((char *)&local_338);
            qLcKmsDebug();
            if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
                != 0) {
              local_1f8._0_4_ = 2;
              local_1f8._4_4_ = 0;
              local_1f8._8_4_ = 0;
              local_1f8._12_4_ = 0;
              local_1f8._16_4_ = 0;
              local_1f8._20_4_ = 0;
              local_1e0 = qLcKmsDebug::category.name;
              QString::toLocal8Bit_helper((QChar *)&local_368,(longlong)local_338.d.ptr);
              pQVar42 = local_368.ptr;
              if (local_368.ptr == (QString *)0x0) {
                pQVar42 = (QString *)&QByteArray::_empty;
              }
              QMessageLogger::debug
                        ((char *)local_1f8.data,"crtc_id:plane_id override list: %s",pQVar42);
              if (&(local_368.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_368.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_368.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if (((local_368.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate(&(local_368.d)->super_QArrayData,1,0x10);
                }
              }
            }
            local_1f8._16_4_ = 0xaaaaaaaa;
            local_1f8._20_4_ = 0xaaaaaaaa;
            local_1f8._0_4_ = 0xaaaaaaaa;
            local_1f8._4_4_ = 0xaaaaaaaa;
            local_1f8._8_4_ = 0xaaaaaaaa;
            local_1f8._12_4_ = 0xaaaaaaaa;
            QString::split(&local_1f8,&local_338,0x3a,0,1);
            if (CONCAT44(local_1f8._20_4_,local_1f8._16_4_) != 0) {
              lVar36 = CONCAT44(local_1f8._12_4_,local_1f8._8_4_);
              lVar35 = lVar36 + CONCAT44(local_1f8._20_4_,local_1f8._16_4_) * 0x18;
              do {
                local_368.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_368.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_368.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
                QString::split(&local_368,lVar36,0x2c,0,1);
                if ((undefined1 *)local_368.size == (undefined1 *)0x2) {
                  QVar87.m_data = ((local_368.ptr)->d).ptr;
                  QVar87.m_size = ((local_368.ptr)->d).size;
                  lVar41 = QString::toIntegral_helper(QVar87,(bool *)0x0,10);
                  iVar30 = (int)lVar41;
                  if ((int)lVar41 != lVar41) {
                    iVar30 = 0;
                  }
                  if (iVar30 == (uint32_t)local_168) {
                    QVar88.m_data = local_368.ptr[1].d.ptr;
                    QVar88.m_size = local_368.ptr[1].d.size;
                    lVar41 = QString::toIntegral_helper(QVar88,(bool *)0x0,10);
                    uVar47 = (uint32_t)lVar41;
                    if ((int)(uint32_t)lVar41 != lVar41) {
                      uVar47 = 0;
                    }
                    iVar38 = QList<QKmsPlane>::begin(this_00);
                    iVar39 = QList<QKmsPlane>::end(this_00);
                    for (; iVar38.i != iVar39.i; iVar38.i = iVar38.i + 1) {
                      if ((iVar38.i)->id == uVar47) {
                        if (local_c0 != (QKmsPlane *)0x0) {
                          local_c0->activeCrtcId = 0;
                        }
                        (iVar38.i)->activeCrtcId = (uint32_t)local_168;
                        local_c0 = iVar38.i;
                        break;
                      }
                    }
                  }
                }
                QArrayDataPointer<QString>::~QArrayDataPointer(&local_368);
                lVar36 = lVar36 + 0x18;
              } while (lVar36 != lVar35);
            }
            QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_1f8)
            ;
            if (&(local_338.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_338.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_338.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_338.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_338.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          if ((local_c0 != (QKmsPlane *)0x0) &&
             (qLcKmsDebug(),
             ((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0
             )) {
            local_1f8._0_4_ = 2;
            local_1f8._4_4_ = 0;
            local_1f8._8_4_ = 0;
            local_1f8._12_4_ = 0;
            local_1f8._16_4_ = 0;
            local_1f8._20_4_ = 0;
            local_1e0 = qLcKmsDebug::category.name;
            pcVar48 = connectorName.d.ptr;
            if (connectorName.d.ptr == (char *)0x0) {
              pcVar48 = (char *)&QByteArray::_empty;
            }
            QMessageLogger::debug
                      ((char *)local_1f8.data,
                       "Chose plane %u for output %s (crtc id %u) (may not be applicable)",
                       (ulong)local_c0->id,pcVar48,local_168 & 0xffffffff);
          }
          if (((this->m_has_atomic_support == true) && (local_c0 == (QKmsPlane *)0x0)) &&
             (qLcKmsDebug(),
             ((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0
             )) {
            local_1f8._0_4_ = 2;
            local_1f8._4_4_ = 0;
            local_1f8._8_4_ = 0;
            local_1f8._12_4_ = 0;
            local_1f8._16_4_ = 0;
            local_1f8._20_4_ = 0;
            local_1e0 = qLcKmsDebug::category.name;
            pcVar48 = connectorName.d.ptr;
            if (connectorName.d.ptr == (char *)0x0) {
              pcVar48 = (char *)&QByteArray::_empty;
            }
            QMessageLogger::debug
                      ((char *)local_1f8.data,
                       "No plane associated with output %s (crtc id %u) and atomic modesetting is enabled. This is bad."
                       ,pcVar48,local_168 & 0xffffffff);
          }
          this->m_crtc_allocator = this->m_crtc_allocator | 1 << (uStack_170._4_1_ & 0x1f);
          QString::operator=(&(vinfo->output).name,(QString *)&local_188);
          *(char **)&(vinfo->output).connector_id = uStack_170;
          *(ulong *)&(vinfo->output).crtc_id = local_168;
          (vinfo->output).physical_size.wd = (qreal)local_160;
          (vinfo->output).physical_size.ht = (qreal)pQStack_158;
          (vinfo->output).preferred_mode = (undefined4)local_150;
          (vinfo->output).mode = local_150._4_4_;
          *(ulong *)&(vinfo->output).mode_set = uStack_148;
          (vinfo->output).saved_crtc = local_140;
          QArrayDataPointer<_drmModeModeInfo>::operator=
                    (&this_01->d,(QArrayDataPointer<_drmModeModeInfo> *)auStack_138);
          *(undefined8 *)&(vinfo->output).subpixel = local_120;
          (vinfo->output).dpms_prop = p_Stack_118;
          (vinfo->output).edid_blob = local_110;
          (vinfo->output).wants_forced_plane = (bool)(char)uStack_108;
          *(int3 *)&(vinfo->output).field_0x81 = (int3)(uStack_108 >> 8);
          (vinfo->output).forced_plane_id = uStack_104;
          *(ulong *)&(vinfo->output).field_0x81 =
               CONCAT17((undefined1)uStack_100,CONCAT43(uStack_104,uStack_108._1_3_));
          *(ulong *)&(vinfo->output).field_0x89 =
               CONCAT17((undefined1)uStack_f8,CONCAT43(uStack_fc,uStack_100._1_3_));
          QString::operator=(&(vinfo->output).clone_source,&QStack_f0);
          QArrayDataPointer<QKmsPlane>::operator=
                    (&(vinfo->output).available_planes.d,(QArrayDataPointer<QKmsPlane> *)auStack_d8)
          ;
          (vinfo->output).eglfs_plane = local_c0;
          (vinfo->output).size = QStack_b8;
          (vinfo->output).crtcIdPropertyId = (uint32_t)local_b0;
          (vinfo->output).modeIdPropertyId = local_b0._4_4_;
          (vinfo->output).activePropertyId = QStack_a8.wd.m_i;
          (vinfo->output).mode_blob_id = QStack_a8.ht.m_i;
          iVar30 = (*this->_vptr_QKmsDevice[5])(this,&local_188);
          pQVar46 = (QPlatformScreen *)CONCAT44(extraout_var,iVar30);
          if ((QArrayData *)local_218._0_8_ != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_218._0_8_ = *(int *)local_218._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_218._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_218._0_8_,2,0x10);
            }
          }
          QArrayDataPointer<QKmsPlane>::~QArrayDataPointer
                    ((QArrayDataPointer<QKmsPlane> *)auStack_d8);
          piVar40 = (int *)CONCAT44(QStack_f0.d.d._4_4_,(uint)QStack_f0.d.d);
          if (piVar40 != (int *)0x0) {
            LOCK();
            *piVar40 = *piVar40 + -1;
            UNLOCK();
            if (*piVar40 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT44(QStack_f0.d.d._4_4_,(uint)QStack_f0.d.d),2,0x10);
            }
          }
          if ((QArrayData *)auStack_138._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)auStack_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)auStack_138._0_8_)->_q_value).super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)auStack_138._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                0) {
              QArrayData::deallocate((QArrayData *)auStack_138._0_8_,0x44,0x10);
            }
          }
          piVar40 = (int *)CONCAT44(local_188._4_4_,local_188._0_4_);
          if (piVar40 != (int *)0x0) {
            LOCK();
            *piVar40 = *piVar40 + -1;
            UNLOCK();
            if (*piVar40 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(local_188._4_4_,local_188._0_4_),2,0x10)
              ;
            }
          }
          if ((QArrayData *)local_310._8_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_310._8_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_310._8_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_310._8_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_310._8_8_,1,0x10);
            }
          }
          if ((QArrayData *)auStack_300._24_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)auStack_300._24_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)auStack_300._24_8_)->_q_value).super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)auStack_300._24_8_)->_q_value).super___atomic_base<int>._M_i ==
                0) {
              QArrayData::deallocate((QArrayData *)auStack_300._24_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_238._0_8_ != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_238._0_8_ = *(int *)local_238._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_238._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_238._0_8_,1,0x10);
            }
          }
        }
        if (&(local_2b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_2b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_2b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_2b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_2b8.d.d)->super_QArrayData,0x44,0x10);
          }
        }
        goto LAB_00132b86;
      }
      qLcKmsDebug();
      if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        local_188._0_4_ = 2;
        local_188._4_4_ = 0;
        local_188._8_4_ = 0;
        local_188._12_4_ = 0;
        local_188._16_4_ = 0;
        local_188._20_4_ = 0;
        uStack_170 = qLcKmsDebug::category.name;
        QMessageLogger::debug();
        pQVar44 = (QTextStream *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
        psVar49 = (storage_type *)0xf;
        goto LAB_00132405;
      }
    }
LAB_00132b84:
    pQVar46 = (QPlatformScreen *)0x0;
  }
LAB_00132b86:
  if (&(local_298.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_298.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_298.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_298.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_298.d.d)->super_QArrayData,1,0x10);
    }
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&userConnectorConfig.d);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&userConfig.d);
LAB_00132bc9:
  if (connectorName.d.d != (Data *)0x0) {
    LOCK();
    ((connectorName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((connectorName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((connectorName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(connectorName.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return pQVar46;
  }
  __stack_chk_fail();
}

Assistant:

QPlatformScreen *QKmsDevice::createScreenForConnector(drmModeResPtr resources,
                                                      drmModeConnectorPtr connector,
                                                      ScreenInfo *vinfo)
{
    Q_ASSERT(vinfo);
    const QByteArray connectorName = nameForConnector(connector);

    const int crtc = crtcForConnector(resources, connector);
    if (crtc < 0) {
        qWarning() << "No usable crtc/encoder pair for connector" << connectorName;
        return nullptr;
    }

    OutputConfiguration configuration;
    QSize configurationSize;
    int configurationRefresh = 0;
    drmModeModeInfo configurationModeline;

    auto userConfig = m_screenConfig->outputSettings();
    QVariantMap userConnectorConfig = userConfig.value(QString::fromUtf8(connectorName));
    // default to the preferred mode unless overridden in the config
    const QByteArray mode = userConnectorConfig.value(QStringLiteral("mode"), QStringLiteral("preferred"))
        .toByteArray().toLower();
    if (mode == "off") {
        configuration = OutputConfigOff;
    } else if (mode == "preferred") {
        configuration = OutputConfigPreferred;
    } else if (mode == "current") {
        configuration = OutputConfigCurrent;
    } else if (mode == "skip") {
        configuration = OutputConfigSkip;
    } else if (sscanf(mode.constData(), "%dx%d@%d", &configurationSize.rwidth(), &configurationSize.rheight(),
                      &configurationRefresh) == 3)
    {
        configuration = OutputConfigMode;
    } else if (sscanf(mode.constData(), "%dx%d", &configurationSize.rwidth(), &configurationSize.rheight()) == 2) {
        configuration = OutputConfigMode;
    } else if (parseModeline(mode, &configurationModeline)) {
        configuration = OutputConfigModeline;
    } else {
        qWarning("Invalid mode \"%s\" for output %s", mode.constData(), connectorName.constData());
        configuration = OutputConfigPreferred;
    }

    *vinfo = ScreenInfo();
    vinfo->virtualIndex = userConnectorConfig.value(QStringLiteral("virtualIndex"), INT_MAX).toInt();
    if (userConnectorConfig.contains(QStringLiteral("virtualPos"))) {
        const QByteArray vpos = userConnectorConfig.value(QStringLiteral("virtualPos")).toByteArray();
        const QByteArrayList vposComp = vpos.split(',');
        if (vposComp.size() == 2)
            vinfo->virtualPos = QPoint(vposComp[0].trimmed().toInt(), vposComp[1].trimmed().toInt());
    }
    if (userConnectorConfig.value(QStringLiteral("primary")).toBool())
        vinfo->isPrimary = true;

    const uint32_t crtc_id = resources->crtcs[crtc];

    if (configuration == OutputConfigOff) {
        qCDebug(qLcKmsDebug) << "Turning off output" << connectorName;
        drmModeSetCrtc(m_dri_fd, crtc_id, 0, 0, 0, 0, 0, nullptr);
        return nullptr;
    }

    // Skip disconnected output
    if (configuration == OutputConfigPreferred && connector->connection == DRM_MODE_DISCONNECTED) {
        qCDebug(qLcKmsDebug) << "Skipping disconnected output" << connectorName;
        return nullptr;
    }

    if (configuration == OutputConfigSkip) {
        qCDebug(qLcKmsDebug) << "Skipping output" << connectorName;
        return nullptr;
    }

    // Get the current mode on the current crtc
    drmModeModeInfo crtc_mode;
    memset(&crtc_mode, 0, sizeof crtc_mode);
    if (drmModeEncoderPtr encoder = drmModeGetEncoder(m_dri_fd, connector->encoder_id)) {
        drmModeCrtcPtr crtc = drmModeGetCrtc(m_dri_fd, encoder->crtc_id);
        drmModeFreeEncoder(encoder);

        if (!crtc)
            return nullptr;

        if (crtc->mode_valid)
            crtc_mode = crtc->mode;

        drmModeFreeCrtc(crtc);
    }

    QList<drmModeModeInfo> modes;
    modes.reserve(connector->count_modes);
    qCDebug(qLcKmsDebug) << connectorName << "mode count:" << connector->count_modes
                         << "crtc index:" << crtc << "crtc id:" << crtc_id;
    for (int i = 0; i < connector->count_modes; i++) {
        const drmModeModeInfo &mode = connector->modes[i];
        qCDebug(qLcKmsDebug) << "mode" << i << mode.hdisplay << "x" << mode.vdisplay
                                  << '@' << mode.vrefresh << "hz";
        modes << connector->modes[i];
    }

    int preferred = -1;
    int current = -1;
    int configured = -1;
    int best = -1;

    for (int i = modes.size() - 1; i >= 0; i--) {
        const drmModeModeInfo &m = modes.at(i);

        if (configuration == OutputConfigMode
                && m.hdisplay == configurationSize.width()
                && m.vdisplay == configurationSize.height()
                && (!configurationRefresh || m.vrefresh == uint32_t(configurationRefresh)))
        {
            configured = i;
        }

        if (!memcmp(&crtc_mode, &m, sizeof m))
            current = i;

        if (m.type & DRM_MODE_TYPE_PREFERRED)
            preferred = i;

        best = i;
    }

    if (configuration == OutputConfigModeline) {
        modes << configurationModeline;
        configured = modes.size() - 1;
    }

    if (current < 0 && crtc_mode.clock != 0) {
        modes << crtc_mode;
        current = modes.size() - 1;
    }

    if (configuration == OutputConfigCurrent)
        configured = current;

    int selected_mode = -1;

    if (configured >= 0)
        selected_mode = configured;
    else if (preferred >= 0)
        selected_mode = preferred;
    else if (current >= 0)
        selected_mode = current;
    else if (best >= 0)
        selected_mode = best;

    if (selected_mode < 0) {
        qWarning() << "No modes available for output" << connectorName;
        return nullptr;
    } else {
        int width = modes[selected_mode].hdisplay;
        int height = modes[selected_mode].vdisplay;
        int refresh = modes[selected_mode].vrefresh;
        qCDebug(qLcKmsDebug) << "Selected mode" << selected_mode << ":" << width << "x" << height
                                  << '@' << refresh << "hz for output" << connectorName;
    }

    // physical size from connector < config values < env vars
    int pwidth = qEnvironmentVariableIntValue("QT_QPA_EGLFS_PHYSICAL_WIDTH");
    if (!pwidth)
        pwidth = qEnvironmentVariableIntValue("QT_QPA_PHYSICAL_WIDTH");
    int pheight = qEnvironmentVariableIntValue("QT_QPA_EGLFS_PHYSICAL_HEIGHT");
    if (!pheight)
        pheight = qEnvironmentVariableIntValue("QT_QPA_PHYSICAL_HEIGHT");
    QSizeF physSize(pwidth, pheight);
    if (physSize.isEmpty()) {
        physSize = QSize(userConnectorConfig.value(QStringLiteral("physicalWidth")).toInt(),
                         userConnectorConfig.value(QStringLiteral("physicalHeight")).toInt());
        if (physSize.isEmpty()) {
            physSize.setWidth(connector->mmWidth);
            physSize.setHeight(connector->mmHeight);
        }
    }
    qCDebug(qLcKmsDebug) << "Physical size is" << physSize << "mm" << "for output" << connectorName;

    const QByteArray formatStr = userConnectorConfig.value(QStringLiteral("format"), QString())
            .toByteArray().toLower();
    uint32_t drmFormat;
    bool drmFormatExplicit = true;
    if (formatStr.isEmpty()) {
        drmFormat = DRM_FORMAT_XRGB8888;
        drmFormatExplicit = false;
    } else if (formatStr == "xrgb8888") {
        drmFormat = DRM_FORMAT_XRGB8888;
    } else if (formatStr == "xbgr8888") {
        drmFormat = DRM_FORMAT_XBGR8888;
    } else if (formatStr == "argb8888") {
        drmFormat = DRM_FORMAT_ARGB8888;
    } else if (formatStr == "abgr8888") {
        drmFormat = DRM_FORMAT_ABGR8888;
    } else if (formatStr == "rgb565") {
        drmFormat = DRM_FORMAT_RGB565;
    } else if (formatStr == "bgr565") {
        drmFormat = DRM_FORMAT_BGR565;
    } else if (formatStr == "xrgb2101010") {
        drmFormat = DRM_FORMAT_XRGB2101010;
    } else if (formatStr == "xbgr2101010") {
        drmFormat = DRM_FORMAT_XBGR2101010;
    } else if (formatStr == "argb2101010") {
        drmFormat = DRM_FORMAT_ARGB2101010;
    } else if (formatStr == "abgr2101010") {
        drmFormat = DRM_FORMAT_ABGR2101010;
    } else {
        qWarning("Invalid pixel format \"%s\" for output %s", formatStr.constData(), connectorName.constData());
        drmFormat = DRM_FORMAT_XRGB8888;
        drmFormatExplicit = false;
    }
    qCDebug(qLcKmsDebug) << "Format is" << Qt::hex << drmFormat << Qt::dec << "requested_by_user =" << drmFormatExplicit
                         << "for output" << connectorName;

    const QString cloneSource = userConnectorConfig.value(QStringLiteral("clones")).toString();
    if (!cloneSource.isEmpty())
        qCDebug(qLcKmsDebug) << "Output" << connectorName << " clones output " << cloneSource;

    QSize framebufferSize;
    bool framebufferSizeSet = false;
    const QByteArray fbsize = userConnectorConfig.value(QStringLiteral("size")).toByteArray().toLower();
    if (!fbsize.isEmpty()) {
        if (sscanf(fbsize.constData(), "%dx%d", &framebufferSize.rwidth(), &framebufferSize.rheight()) == 2) {
#if QT_CONFIG(drm_atomic)
            if (hasAtomicSupport())
                framebufferSizeSet = true;
#endif
            if (!framebufferSizeSet)
                qWarning("Setting framebuffer size is only available with DRM atomic API");
        } else {
            qWarning("Invalid framebuffer size '%s'", fbsize.constData());
        }
    }
    if (!framebufferSizeSet) {
        framebufferSize.setWidth(modes[selected_mode].hdisplay);
        framebufferSize.setHeight(modes[selected_mode].vdisplay);
    }

    qCDebug(qLcKmsDebug) << "Output" << connectorName << "framebuffer size is " << framebufferSize;

    QKmsOutput output;
    output.name = QString::fromUtf8(connectorName);
    output.connector_id = connector->connector_id;
    output.crtc_index = crtc;
    output.crtc_id = crtc_id;
    output.physical_size = physSize;
    output.preferred_mode = preferred >= 0 ? preferred : selected_mode;
    output.mode = selected_mode;
    output.mode_set = false;
    output.saved_crtc = drmModeGetCrtc(m_dri_fd, crtc_id);
    output.modes = modes;
    output.subpixel = connector->subpixel;
    output.dpms_prop = connectorProperty(connector, QByteArrayLiteral("DPMS"));
    output.edid_blob = connectorPropertyBlob(connector, QByteArrayLiteral("EDID"));
    output.wants_forced_plane = false;
    output.forced_plane_id = 0;
    output.forced_plane_set = false;
    output.drm_format = drmFormat;
    output.drm_format_requested_by_user = drmFormatExplicit;
    output.clone_source = cloneSource;
    output.size = framebufferSize;

#if QT_CONFIG(drm_atomic)
    if (drmModeCreatePropertyBlob(m_dri_fd, &modes[selected_mode], sizeof(drmModeModeInfo),
                                  &output.mode_blob_id) != 0) {
        qCDebug(qLcKmsDebug) << "Failed to create mode blob for mode" << selected_mode;
    }

    parseConnectorProperties(output.connector_id, &output);
    parseCrtcProperties(output.crtc_id, &output);
#endif

    QString planeListStr;
    for (QKmsPlane &plane : m_planes) {
        if (plane.possibleCrtcs & (1 << output.crtc_index)) {
            output.available_planes.append(plane);
            planeListStr.append(QString::number(plane.id));
            planeListStr.append(u' ');

            // Choose the first primary plane that is not already assigned to
            // another screen's associated crtc.
            if (!output.eglfs_plane && plane.type == QKmsPlane::PrimaryPlane && !plane.activeCrtcId)
                assignPlane(&output, &plane);
        }
    }
    qCDebug(qLcKmsDebug, "Output %s can use %d planes: %s",
            connectorName.constData(), int(output.available_planes.size()), qPrintable(planeListStr));

    // This is for the EGLDevice/EGLStream backend. On some of those devices one
    // may want to target a pre-configured plane. It is probably useless for
    // eglfs_kms and others. Do not confuse with generic plane support (available_planes).
    bool ok;
    int idx = qEnvironmentVariableIntValue("QT_QPA_EGLFS_KMS_PLANE_INDEX", &ok);
    if (ok) {
        drmModePlaneRes *planeResources = drmModeGetPlaneResources(m_dri_fd);
        if (planeResources) {
            if (idx >= 0 && idx < int(planeResources->count_planes)) {
                drmModePlane *plane = drmModeGetPlane(m_dri_fd, planeResources->planes[idx]);
                if (plane) {
                    output.wants_forced_plane = true;
                    output.forced_plane_id = plane->plane_id;
                    qCDebug(qLcKmsDebug, "Forcing plane index %d, plane id %u (belongs to crtc id %u)",
                            idx, plane->plane_id, plane->crtc_id);

                    for (QKmsPlane &kmsplane : m_planes) {
                        if (kmsplane.id == output.forced_plane_id) {
                            assignPlane(&output, &kmsplane);
                            break;
                        }
                    }

                    drmModeFreePlane(plane);
                }
            } else {
                qWarning("Invalid plane index %d, must be between 0 and %u", idx, planeResources->count_planes - 1);
            }
        }
    }

    // A more useful version: allows specifying "crtc_id,plane_id:crtc_id,plane_id:..."
    // in order to allow overriding the plane used for a given crtc.
    if (qEnvironmentVariableIsSet("QT_QPA_EGLFS_KMS_PLANES_FOR_CRTCS")) {
        const QString val = qEnvironmentVariable("QT_QPA_EGLFS_KMS_PLANES_FOR_CRTCS");
        qCDebug(qLcKmsDebug, "crtc_id:plane_id override list: %s", qPrintable(val));
        const QStringList crtcPlanePairs = val.split(u':');
        for (const QString &crtcPlanePair : crtcPlanePairs) {
            const QStringList values = crtcPlanePair.split(u',');
            if (values.size() == 2 && uint(values[0].toInt()) == output.crtc_id) {
                uint planeId = values[1].toInt();
                for (QKmsPlane &kmsplane : m_planes) {
                    if (kmsplane.id == planeId) {
                        assignPlane(&output, &kmsplane);
                        break;
                    }
                }
            }
        }
    }

    if (output.eglfs_plane) {
        qCDebug(qLcKmsDebug, "Chose plane %u for output %s (crtc id %u) (may not be applicable)",
                output.eglfs_plane->id, connectorName.constData(), output.crtc_id);
    }

#if QT_CONFIG(drm_atomic)
    if (hasAtomicSupport() && !output.eglfs_plane) {
        qCDebug(qLcKmsDebug, "No plane associated with output %s (crtc id %u) and atomic modesetting is enabled. This is bad.",
                connectorName.constData(), output.crtc_id);
    }
#endif

    m_crtc_allocator |= (1 << output.crtc_index);

    vinfo->output = output;

    return createScreen(output);
}